

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::Fsmooth
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs)

{
  bool bVar1;
  Geometry *this_00;
  BoxArray *this_01;
  BoxArray *bxs;
  FabArrayBase *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Array4<const_int> *dmskarr_7;
  Array4<const_double> *rhsarr_7;
  Array4<const_double> *Axarr_3;
  Array4<double> *solarr_7;
  Array4<const_double> *sarr_1;
  Box *bx_7;
  MFIter mfi_7;
  Array4<const_int> *dmskarr_6;
  Array4<const_double> *rhsarr_6;
  Array4<const_double> *Axarr_2;
  Array4<double> *solarr_6;
  Array4<const_double> *szarr_1;
  Array4<const_double> *syarr_1;
  Array4<const_double> *sxarr_1;
  Box *bx_6;
  MFIter mfi_6;
  Array4<const_int> *dmskarr_5;
  Array4<const_double> *rhsarr_5;
  Array4<const_double> *Axarr_1;
  Array4<double> *solarr_5;
  Box *bx_5;
  MFIter mfi_5;
  Real const_sigma_1;
  Array4<const_int> *dmskarr_4;
  Array4<const_double> *stenarr;
  Array4<const_double> *rhsarr_4;
  Array4<const_double> *Axarr;
  Array4<double> *solarr_4;
  Box *bx_4;
  MFIter mfi_4;
  MultiFab Ax_3;
  int ns_4;
  int ns_3;
  Array4<const_int> *dmskarr_3;
  Array4<const_double> *rhsarr_3;
  Array4<double> *solarr_3;
  Array4<const_double> *sarr;
  Box *bx_3;
  MFIter mfi_3;
  int ns_2;
  Array4<const_int> *dmskarr_2;
  Array4<const_double> *rhsarr_2;
  Array4<double> *solarr_2;
  Array4<const_double> *szarr;
  Array4<const_double> *syarr;
  Array4<const_double> *sxarr;
  Box *bx_2;
  MFIter mfi_2;
  int ns_1;
  Array4<const_int> *dmskarr_1;
  Array4<const_double> *rhsarr_1;
  Array4<double> *solarr_1;
  Box *bx_1;
  MFIter mfi_1;
  Real const_sigma;
  int ns;
  Array4<const_int> *dmskarr;
  Array4<const_double> *starr;
  Array4<const_double> *rhsarr;
  Array4<double> *solarr;
  Box *bx;
  MFIter mfi;
  bool regular_coarsening;
  iMultiFab *dmsk;
  GpuArray<double,_3U> dxinvarr;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *stencil;
  array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *sigma;
  Real fm2xm2y4z;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fmx2y2z;
  Real fxyz;
  Real facz;
  Real facy;
  Real facx;
  Real facz_1;
  Real facy_1;
  Real facx_1;
  Real fm2xm2y4z_1;
  Real fm2x4ym2z_1;
  Real f4xm2ym2z_1;
  Real f2x2ymz_1;
  Real f2xmy2z_1;
  Real fmx2y2z_1;
  Real fxyz_1;
  Real facz_2;
  Real facy_2;
  Real facx_2;
  int i_9;
  Real Ax_2;
  Real s0_2;
  int i_6;
  int k_3;
  int j_3;
  int j_2;
  Real Ax_1;
  Real s0_1;
  int j_1;
  int i_3;
  int k_2;
  int k_1;
  Real Ax;
  Real s0;
  int k;
  int i;
  int j;
  Array1D<double,_0,_31> gam;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> b_ls;
  Array1D<double,_0,_31> a_ls;
  int ilen;
  int idir;
  Dim3 hi;
  Dim3 lo;
  Real fm2xm2y4z_2;
  Real fm2x4ym2z_2;
  Real f4xm2ym2z_2;
  Real f2x2ymz_2;
  Real f2xmy2z_2;
  Real fmx2y2z_2;
  Real fxyz_2;
  Real facz_3;
  Real facy_3;
  Real facx_3;
  Real fxyz_3;
  Real facz_4;
  Real facy_4;
  Real facx_4;
  Real fxyz_4;
  int i_2;
  int i_1;
  Real bet;
  int i_5;
  int i_4;
  Real bet_1;
  int i_8;
  int i_7;
  Real bet_2;
  nullptr_t in_stack_ffffffffffffb658;
  FabArrayBase *__n;
  MFIter *in_stack_ffffffffffffb660;
  undefined8 in_stack_ffffffffffffb668;
  MFIter *in_stack_ffffffffffffb670;
  MFInfo *in_stack_ffffffffffffb680;
  uchar flags_;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffb688;
  FabArrayBase *fabarray_;
  MLNodeLinOp *in_stack_ffffffffffffb690;
  anon_class_408_9_11dfeee2 *in_stack_ffffffffffffb6a0;
  anon_class_472_10_2a1b4a53 *f;
  Box *in_stack_ffffffffffffb6a8;
  Box *bx_00;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffb6b0;
  MFIter *in_stack_ffffffffffffb6c0;
  bool local_4929;
  undefined1 local_4920 [64];
  undefined1 *local_48e0;
  undefined1 local_48d8 [64];
  undefined1 *local_4898;
  undefined1 local_4890 [64];
  undefined1 *local_4850;
  undefined1 local_4848 [64];
  undefined1 *local_4808;
  undefined1 local_4800 [64];
  undefined1 *local_47c0;
  undefined8 local_4798;
  undefined8 in_stack_ffffffffffffb878;
  undefined4 in_stack_ffffffffffffb884;
  undefined8 in_stack_ffffffffffffb888;
  undefined8 in_stack_ffffffffffffb890;
  undefined1 local_4730 [64];
  undefined1 *local_46f0;
  undefined1 local_46e8 [64];
  undefined1 *local_46a8;
  undefined1 local_46a0 [64];
  undefined1 *local_4660;
  undefined1 local_4658 [64];
  undefined1 *local_4618;
  undefined1 local_4610 [24];
  MultiFab *in_stack_ffffffffffffba08;
  MultiFab *in_stack_ffffffffffffba10;
  int in_stack_ffffffffffffba18;
  int in_stack_ffffffffffffba1c;
  MLNodeLaplacian *in_stack_ffffffffffffba20;
  undefined1 local_45c8 [64];
  undefined1 *local_4588;
  undefined1 local_4580 [64];
  undefined1 *local_4540;
  undefined1 local_4534 [28];
  undefined1 *local_4518;
  MFIter local_4510;
  undefined1 local_44b0 [64];
  undefined1 *local_4470;
  undefined1 local_4468 [64];
  undefined1 *local_4428;
  undefined1 local_4420 [64];
  undefined1 *local_43e0;
  undefined1 local_43d8 [64];
  undefined1 *local_4398;
  undefined1 local_438c [28];
  undefined1 *local_4370;
  MFIter local_4368;
  undefined8 local_4308;
  undefined1 local_4300 [64];
  undefined1 *local_42c0;
  undefined1 local_42b8 [64];
  undefined1 *local_4278;
  undefined1 local_4270 [64];
  undefined1 *local_4230;
  undefined1 local_4228 [64];
  undefined1 *local_41e8;
  undefined1 local_41e0 [64];
  undefined1 *local_41a0;
  undefined1 local_4194 [28];
  undefined1 *local_4178;
  MFIter local_4170;
  undefined1 local_4100 [8];
  anon_class_472_10_2a1b4a53 local_40f8;
  Long *local_3f08;
  long local_3f00 [8];
  long *local_3ec0;
  long local_3eb8 [8];
  long *local_3e78;
  long local_3e70 [8];
  long *local_3e30;
  Box local_3e24;
  Box *local_3e08;
  MFIter local_3e00;
  int local_3d9c;
  undefined1 local_3d98 [64];
  undefined1 *local_3d58;
  undefined1 local_3d50 [64];
  undefined1 *local_3d10;
  undefined1 local_3d08 [64];
  undefined1 *local_3cc8;
  undefined1 local_3cc0 [64];
  undefined1 *local_3c80;
  undefined1 local_3c78 [64];
  undefined1 *local_3c38;
  undefined1 local_3c30 [64];
  undefined1 *local_3bf0;
  undefined1 local_3be4 [28];
  undefined1 *local_3bc8;
  MFIter local_3bc0;
  int local_3b5c;
  undefined1 local_3b58 [64];
  undefined1 *local_3b18;
  undefined1 local_3b10 [64];
  undefined1 *local_3ad0;
  undefined1 local_3ac8 [64];
  undefined1 *local_3a88;
  undefined1 local_3a7c [28];
  undefined1 *local_3a60;
  MFIter local_3a58;
  undefined8 local_39f8;
  int local_39ec;
  undefined1 local_39e8 [64];
  undefined1 *local_39a8;
  undefined1 local_39a0 [64];
  undefined1 *local_3960;
  undefined1 local_3958 [64];
  undefined1 *local_3918;
  undefined1 local_3910 [64];
  undefined1 *local_38d0;
  undefined1 local_38c4 [28];
  undefined1 *local_38a8;
  MFIter local_38a0;
  bool local_3839;
  type local_3838;
  GpuArray<double,_3U> local_3830;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *local_3818;
  array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *local_3810;
  FabArrayBase *local_3800;
  int local_37f8;
  int local_37f4;
  undefined4 local_37e4;
  IntVect *local_37e0;
  undefined8 local_37d8;
  undefined4 local_37cc;
  char *local_37c8;
  char *local_37c0;
  undefined1 local_37b8 [64];
  undefined1 auStack_3778 [64];
  undefined1 auStack_3738 [64];
  undefined1 auStack_36f8 [64];
  undefined1 *local_36b8;
  undefined1 *local_36b0;
  undefined1 *local_36a8;
  undefined1 *local_36a0;
  undefined1 *local_3698;
  undefined1 local_3690 [64];
  undefined1 auStack_3650 [64];
  double local_3610;
  double local_3608;
  double local_3600;
  double local_35f8;
  double local_35f0;
  double local_35e8;
  double local_35e0;
  undefined1 auStack_35d8 [64];
  undefined8 local_3598;
  double local_3590;
  double local_3588;
  double local_3580;
  double local_3578;
  double local_3570;
  double local_3568;
  double local_3560;
  double local_3558;
  double local_3550;
  double local_3548;
  GpuArray<double,_3U> *local_3540;
  undefined1 *local_3538;
  undefined8 local_3530;
  undefined1 *local_3528;
  undefined1 *local_3520;
  undefined1 *local_3518;
  undefined1 local_3510 [64];
  undefined1 auStack_34d0 [64];
  double local_3490;
  undefined1 auStack_3488 [64];
  double local_3448;
  undefined1 auStack_3440 [64];
  double local_3400;
  undefined1 auStack_33f8 [64];
  undefined1 auStack_33b8 [64];
  double local_3378;
  double local_3370;
  double local_3368;
  GpuArray<double,_3U> *local_3360;
  undefined1 *local_3358;
  undefined1 *local_3350;
  undefined1 *local_3348;
  undefined1 *local_3340;
  undefined1 *local_3338;
  undefined1 *local_3330;
  undefined1 *local_3328;
  undefined1 local_3320 [64];
  undefined1 auStack_32e0 [64];
  double local_32a0;
  undefined1 auStack_3298 [64];
  double local_3258;
  double local_3250;
  double local_3248;
  double local_3240;
  double local_3238;
  double local_3230;
  undefined1 auStack_3228 [64];
  double local_31e8;
  double local_31e0;
  double local_31d8;
  double local_31d0;
  double local_31c8;
  double local_31c0;
  double local_31b8;
  double local_31b0;
  double local_31a8;
  double local_31a0;
  GpuArray<double,_3U> *local_3198;
  Long *local_3190;
  long *local_3188;
  long *local_3180;
  long *local_3178;
  Box *local_3170;
  int local_3164;
  double local_3160;
  double local_3158;
  int local_3150;
  int local_314c;
  int local_3148;
  int local_3144;
  double local_3140;
  double local_3138;
  int local_3130;
  int local_312c;
  int local_3128;
  int local_3124;
  double local_3120;
  double local_3118;
  int local_310c;
  int local_3108;
  int local_3104;
  undefined1 local_3100 [256];
  double local_3000 [32];
  double local_2f00 [32];
  double local_2e00 [32];
  double local_2d00 [32];
  double local_2c00 [32];
  int local_2b00;
  int local_2afc;
  undefined8 local_2af8;
  int local_2af0;
  undefined8 local_2ae4;
  int local_2adc;
  undefined8 local_2ad8;
  int local_2ad0;
  undefined8 local_2ac8;
  int local_2ac0;
  double local_2ab8;
  double local_2ab0;
  double local_2aa8;
  double local_2aa0;
  double local_2a98;
  double local_2a90;
  double local_2a88;
  double local_2a80;
  double local_2a78;
  double local_2a70;
  GpuArray<double,_3U> *local_2a68;
  Long *local_2a60;
  long *local_2a58;
  long *local_2a50;
  long *local_2a48;
  Box *local_2a40;
  undefined8 local_2a38;
  int local_2a30;
  Box *local_2a28;
  int local_2a1c;
  int iStack_2a18;
  int local_2a14;
  undefined8 local_2a10;
  int local_2a08;
  Box *local_2a00;
  int local_29f4;
  int iStack_29f0;
  int local_29ec;
  undefined1 local_29e8 [64];
  undefined1 auStack_29a8 [64];
  undefined1 auStack_2968 [64];
  undefined1 auStack_2928 [64];
  undefined1 auStack_28e8 [64];
  undefined1 *local_28a8;
  undefined1 *local_28a0;
  undefined1 *local_2898;
  undefined1 *local_2890;
  undefined1 *local_2888;
  undefined1 *local_2880;
  undefined1 local_2878 [64];
  undefined1 auStack_2838 [64];
  undefined1 auStack_27f8 [64];
  undefined1 auStack_27b8 [64];
  double local_2778;
  undefined8 local_2770;
  double local_2768;
  GpuArray<double,_3U> *local_2760;
  undefined1 *local_2758;
  undefined8 local_2750;
  undefined1 *local_2748;
  undefined1 *local_2740;
  undefined1 *local_2738;
  undefined1 *local_2730;
  undefined1 local_2728 [64];
  undefined1 auStack_26e8 [64];
  undefined1 auStack_26a8 [64];
  undefined1 auStack_2668 [64];
  double local_2628;
  undefined1 auStack_2620 [64];
  double local_25e0;
  undefined1 auStack_25d8 [64];
  double local_2598;
  undefined1 auStack_2590 [64];
  double local_2550;
  double local_2548;
  double local_2540;
  GpuArray<double,_3U> *local_2538;
  undefined1 *local_2530;
  undefined1 *local_2528;
  undefined1 *local_2520;
  undefined1 *local_2518;
  undefined1 *local_2510;
  undefined1 *local_2508;
  undefined1 *local_2500;
  undefined1 *local_24f8;
  undefined1 local_24f0 [64];
  undefined1 auStack_24b0 [64];
  undefined1 auStack_2470 [64];
  undefined1 auStack_2430 [64];
  double local_23f0;
  undefined1 auStack_23e8 [64];
  double local_23a8;
  GpuArray<double,_3U> *local_23a0;
  undefined1 *local_2398;
  undefined1 *local_2390;
  undefined1 *local_2388;
  undefined1 *local_2380;
  undefined1 *local_2378;
  FabArray<amrex::FArrayBox> *local_2370;
  undefined4 local_2364;
  IntVect *local_2360;
  undefined4 local_2354;
  IntVect *local_2350;
  undefined4 local_2344;
  IntVect *local_2340;
  undefined4 local_2334;
  Box *local_2330;
  undefined4 local_2324;
  Box *local_2320;
  undefined4 local_2314;
  Box *local_2310;
  int local_2304;
  int local_2300;
  int local_22fc;
  long *local_22f8;
  int local_22ec;
  int local_22e8;
  int local_22e4;
  long *local_22e0;
  int local_22d4;
  int local_22d0;
  int local_22cc;
  long *local_22c8;
  int local_22bc;
  int local_22b8;
  int local_22b4;
  long *local_22b0;
  int local_22a4;
  int local_22a0;
  int local_229c;
  long *local_2298;
  int local_228c;
  int local_2288;
  int local_2284;
  long *local_2280;
  int local_2274;
  int local_2270;
  int local_226c;
  long *local_2268;
  int local_225c;
  int local_2258;
  int local_2254;
  long *local_2250;
  int local_2244;
  int local_2240;
  int local_223c;
  long *local_2238;
  int local_222c;
  int local_2228;
  int local_2224;
  long *local_2220;
  int local_2214;
  int local_2210;
  int local_220c;
  long *local_2208;
  int local_21fc;
  int local_21f8;
  int local_21f4;
  long *local_21f0;
  int local_21e4;
  int local_21e0;
  int local_21dc;
  long *local_21d8;
  int local_21cc;
  int local_21c8;
  int local_21c4;
  long *local_21c0;
  int local_21b4;
  int local_21b0;
  int local_21ac;
  long *local_21a8;
  int local_219c;
  int local_2198;
  int local_2194;
  long *local_2190;
  int local_2184;
  int local_2180;
  int local_217c;
  long *local_2178;
  int local_216c;
  int local_2168;
  int local_2164;
  long *local_2160;
  int local_2154;
  int local_2150;
  int local_214c;
  long *local_2148;
  int local_213c;
  int local_2138;
  int local_2134;
  long *local_2130;
  int local_2124;
  int local_2120;
  int local_211c;
  long *local_2118;
  int local_210c;
  int local_2108;
  int local_2104;
  long *local_2100;
  int local_20f4;
  int local_20f0;
  int local_20ec;
  long *local_20e8;
  int local_20dc;
  int local_20d8;
  int local_20d4;
  long *local_20d0;
  int local_20c4;
  int local_20c0;
  int local_20bc;
  long *local_20b8;
  int local_20ac;
  int local_20a8;
  int local_20a4;
  long *local_20a0;
  int local_2094;
  int local_2090;
  int local_208c;
  long *local_2088;
  int local_207c;
  int local_2078;
  int local_2074;
  long *local_2070;
  int local_2064;
  int local_2060;
  int local_205c;
  long *local_2058;
  int local_204c;
  int local_2048;
  int local_2044;
  long *local_2040;
  int local_2034;
  int local_2030;
  int local_202c;
  long *local_2028;
  int local_201c;
  int local_2018;
  int local_2014;
  long *local_2010;
  int local_2004;
  int local_2000;
  int local_1ffc;
  long *local_1ff8;
  int local_1fec;
  int local_1fe8;
  int local_1fe4;
  long *local_1fe0;
  int local_1fd4;
  int local_1fd0;
  int local_1fcc;
  long *local_1fc8;
  int local_1fbc;
  int local_1fb8;
  int local_1fb4;
  long *local_1fb0;
  int local_1fa4;
  int local_1fa0;
  int local_1f9c;
  long *local_1f98;
  int local_1f8c;
  int local_1f88;
  int local_1f84;
  long *local_1f80;
  int local_1f74;
  int local_1f70;
  int local_1f6c;
  long *local_1f68;
  int local_1f5c;
  int local_1f58;
  int local_1f54;
  long *local_1f50;
  int local_1f44;
  int local_1f40;
  int local_1f3c;
  long *local_1f38;
  int local_1f2c;
  int local_1f28;
  int local_1f24;
  long *local_1f20;
  int local_1f14;
  int local_1f10;
  int local_1f0c;
  long *local_1f08;
  int local_1efc;
  int local_1ef8;
  int local_1ef4;
  long *local_1ef0;
  int local_1ee4;
  int local_1ee0;
  int local_1edc;
  long *local_1ed8;
  int local_1ecc;
  int local_1ec8;
  int local_1ec4;
  long *local_1ec0;
  int local_1eb4;
  int local_1eb0;
  int local_1eac;
  long *local_1ea8;
  int local_1e9c;
  int local_1e98;
  int local_1e94;
  long *local_1e90;
  int local_1e84;
  int local_1e80;
  int local_1e7c;
  long *local_1e78;
  int local_1e6c;
  int local_1e68;
  int local_1e64;
  long *local_1e60;
  int local_1e54;
  int local_1e50;
  int local_1e4c;
  long *local_1e48;
  int local_1e3c;
  int local_1e38;
  int local_1e34;
  long *local_1e30;
  int local_1e24;
  int local_1e20;
  int local_1e1c;
  long *local_1e18;
  int local_1e0c;
  int local_1e08;
  int local_1e04;
  long *local_1e00;
  int local_1df4;
  int local_1df0;
  int local_1dec;
  long *local_1de8;
  int local_1ddc;
  int local_1dd8;
  int local_1dd4;
  long *local_1dd0;
  int local_1dc4;
  int local_1dc0;
  int local_1dbc;
  long *local_1db8;
  int local_1dac;
  int local_1da8;
  int local_1da4;
  long *local_1da0;
  int local_1d94;
  int local_1d90;
  int local_1d8c;
  long *local_1d88;
  int local_1d7c;
  int local_1d78;
  int local_1d74;
  long *local_1d70;
  int local_1d64;
  int local_1d60;
  int local_1d5c;
  long *local_1d58;
  int local_1d4c;
  int local_1d48;
  int local_1d44;
  long *local_1d40;
  int local_1d34;
  int local_1d30;
  int local_1d2c;
  long *local_1d28;
  int local_1d1c;
  int local_1d18;
  int local_1d14;
  long *local_1d10;
  int local_1d04;
  int local_1d00;
  int local_1cfc;
  long *local_1cf8;
  int local_1cec;
  int local_1ce8;
  int local_1ce4;
  long *local_1ce0;
  int local_1cd4;
  int local_1cd0;
  int local_1ccc;
  long *local_1cc8;
  int local_1cbc;
  int local_1cb8;
  int local_1cb4;
  long *local_1cb0;
  int local_1ca4;
  int local_1ca0;
  int local_1c9c;
  long *local_1c98;
  int local_1c8c;
  int local_1c88;
  int local_1c84;
  long *local_1c80;
  int local_1c74;
  int local_1c70;
  int local_1c6c;
  long *local_1c68;
  int local_1c5c;
  int local_1c58;
  int local_1c54;
  long *local_1c50;
  int local_1c44;
  int local_1c40;
  int local_1c3c;
  long *local_1c38;
  int local_1c2c;
  int local_1c28;
  int local_1c24;
  long *local_1c20;
  int local_1c14;
  int local_1c10;
  int local_1c0c;
  long *local_1c08;
  int local_1bfc;
  int local_1bf8;
  int local_1bf4;
  long *local_1bf0;
  int local_1be4;
  int local_1be0;
  int local_1bdc;
  long *local_1bd8;
  int local_1bcc;
  int local_1bc8;
  int local_1bc4;
  long *local_1bc0;
  int local_1bb4;
  int local_1bb0;
  int local_1bac;
  long *local_1ba8;
  int local_1b9c;
  int local_1b98;
  int local_1b94;
  long *local_1b90;
  int local_1b84;
  int local_1b80;
  int local_1b7c;
  long *local_1b78;
  int local_1b6c;
  int local_1b68;
  int local_1b64;
  long *local_1b60;
  int local_1b54;
  int local_1b50;
  int local_1b4c;
  long *local_1b48;
  int local_1b3c;
  int local_1b38;
  int local_1b34;
  long *local_1b30;
  int local_1b24;
  int local_1b20;
  int local_1b1c;
  long *local_1b18;
  int local_1b0c;
  int local_1b08;
  int local_1b04;
  long *local_1b00;
  int local_1af4;
  int local_1af0;
  int local_1aec;
  long *local_1ae8;
  int local_1adc;
  int local_1ad8;
  int local_1ad4;
  long *local_1ad0;
  int local_1ac4;
  int local_1ac0;
  int local_1abc;
  long *local_1ab8;
  int local_1aac;
  int local_1aa8;
  int local_1aa4;
  long *local_1aa0;
  int local_1a94;
  int local_1a90;
  int local_1a8c;
  long *local_1a88;
  int local_1a7c;
  int local_1a78;
  int local_1a74;
  long *local_1a70;
  int local_1a64;
  int local_1a60;
  int local_1a5c;
  long *local_1a58;
  int local_1a4c;
  int local_1a48;
  int local_1a44;
  long *local_1a40;
  int local_1a34;
  int local_1a30;
  int local_1a2c;
  long *local_1a28;
  int local_1a1c;
  int local_1a18;
  int local_1a14;
  long *local_1a10;
  int local_1a04;
  int local_1a00;
  int local_19fc;
  long *local_19f8;
  int local_19ec;
  int local_19e8;
  int local_19e4;
  long *local_19e0;
  int local_19d4;
  int local_19d0;
  int local_19cc;
  long *local_19c8;
  int local_19bc;
  int local_19b8;
  int local_19b4;
  long *local_19b0;
  int local_19a4;
  int local_19a0;
  int local_199c;
  long *local_1998;
  int local_198c;
  int local_1988;
  int local_1984;
  long *local_1980;
  int local_1974;
  int local_1970;
  int local_196c;
  long *local_1968;
  int local_195c;
  int local_1958;
  int local_1954;
  long *local_1950;
  int local_1944;
  int local_1940;
  int local_193c;
  long *local_1938;
  int local_192c;
  int local_1928;
  int local_1924;
  long *local_1920;
  int local_1914;
  int local_1910;
  int local_190c;
  long *local_1908;
  int local_18fc;
  int local_18f8;
  int local_18f4;
  long *local_18f0;
  int local_18e4;
  int local_18e0;
  int local_18dc;
  long *local_18d8;
  int local_18cc;
  int local_18c8;
  int local_18c4;
  long *local_18c0;
  int local_18b4;
  int local_18b0;
  int local_18ac;
  long *local_18a8;
  int local_189c;
  int local_1898;
  int local_1894;
  long *local_1890;
  int local_1884;
  int local_1880;
  int local_187c;
  long *local_1878;
  int local_186c;
  int local_1868;
  int local_1864;
  long *local_1860;
  int local_1854;
  int local_1850;
  int local_184c;
  long *local_1848;
  int local_183c;
  int local_1838;
  int local_1834;
  long *local_1830;
  int local_1824;
  int local_1820;
  int local_181c;
  long *local_1818;
  int local_180c;
  int local_1808;
  int local_1804;
  long *local_1800;
  int local_17f4;
  int local_17f0;
  int local_17ec;
  long *local_17e8;
  int local_17dc;
  int local_17d8;
  int local_17d4;
  long *local_17d0;
  int local_17c4;
  int local_17c0;
  int local_17bc;
  long *local_17b8;
  int local_17ac;
  int local_17a8;
  int local_17a4;
  long *local_17a0;
  int local_1794;
  int local_1790;
  int local_178c;
  long *local_1788;
  int local_177c;
  int local_1778;
  int local_1774;
  long *local_1770;
  int local_1764;
  int local_1760;
  int local_175c;
  long *local_1758;
  int local_174c;
  int local_1748;
  int local_1744;
  long *local_1740;
  int local_1734;
  int local_1730;
  int local_172c;
  long *local_1728;
  int local_171c;
  int local_1718;
  int local_1714;
  long *local_1710;
  int local_1704;
  int local_1700;
  int local_16fc;
  long *local_16f8;
  int local_16ec;
  int local_16e8;
  int local_16e4;
  long *local_16e0;
  int local_16d4;
  int local_16d0;
  int local_16cc;
  long *local_16c8;
  int local_16bc;
  int local_16b8;
  int local_16b4;
  long *local_16b0;
  int local_16a4;
  int local_16a0;
  int local_169c;
  long *local_1698;
  int local_168c;
  int local_1688;
  int local_1684;
  long *local_1680;
  int local_1674;
  int local_1670;
  int local_166c;
  long *local_1668;
  int local_165c;
  int local_1658;
  int local_1654;
  long *local_1650;
  int local_1644;
  int local_1640;
  int local_163c;
  long *local_1638;
  int local_162c;
  int local_1628;
  int local_1624;
  long *local_1620;
  int local_1614;
  int local_1610;
  int local_160c;
  long *local_1608;
  int local_15fc;
  int local_15f8;
  int local_15f4;
  long *local_15f0;
  int local_15e4;
  int local_15e0;
  int local_15dc;
  long *local_15d8;
  int local_15cc;
  int local_15c8;
  int local_15c4;
  long *local_15c0;
  int local_15b4;
  int local_15b0;
  int local_15ac;
  long *local_15a8;
  int local_159c;
  int local_1598;
  int local_1594;
  long *local_1590;
  int local_1584;
  int local_1580;
  int local_157c;
  long *local_1578;
  int local_156c;
  int local_1568;
  int local_1564;
  long *local_1560;
  int local_1554;
  int local_1550;
  int local_154c;
  long *local_1548;
  int local_153c;
  int local_1538;
  int local_1534;
  long *local_1530;
  int local_1524;
  int local_1520;
  int local_151c;
  long *local_1518;
  int local_150c;
  int local_1508;
  int local_1504;
  long *local_1500;
  int local_14f4;
  int local_14f0;
  int local_14ec;
  long *local_14e8;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  long *local_14d0;
  int local_14c4;
  int local_14c0;
  int local_14bc;
  long *local_14b8;
  int local_14ac;
  int local_14a8;
  int local_14a4;
  long *local_14a0;
  int local_1494;
  int local_1490;
  int local_148c;
  long *local_1488;
  int local_147c;
  int local_1478;
  int local_1474;
  long *local_1470;
  int local_1464;
  int local_1460;
  int local_145c;
  long *local_1458;
  int local_144c;
  int local_1448;
  int local_1444;
  long *local_1440;
  int local_1434;
  int local_1430;
  int local_142c;
  long *local_1428;
  int local_141c;
  int local_1418;
  int local_1414;
  long *local_1410;
  int local_1404;
  int local_1400;
  int local_13fc;
  long *local_13f8;
  int local_13ec;
  int local_13e8;
  int local_13e4;
  long *local_13e0;
  int local_13d4;
  int local_13d0;
  int local_13cc;
  long *local_13c8;
  int local_13bc;
  int local_13b8;
  int local_13b4;
  long *local_13b0;
  int local_13a4;
  int local_13a0;
  int local_139c;
  long *local_1398;
  int local_138c;
  int local_1388;
  int local_1384;
  long *local_1380;
  int local_1374;
  int local_1370;
  int local_136c;
  long *local_1368;
  int local_135c;
  int local_1358;
  int local_1354;
  long *local_1350;
  int local_1344;
  int local_1340;
  int local_133c;
  long *local_1338;
  int local_132c;
  int local_1328;
  int local_1324;
  long *local_1320;
  int local_1314;
  int local_1310;
  int local_130c;
  long *local_1308;
  int local_12fc;
  int local_12f8;
  int local_12f4;
  long *local_12f0;
  int local_12e4;
  int local_12e0;
  int local_12dc;
  long *local_12d8;
  int local_12cc;
  int local_12c8;
  int local_12c4;
  long *local_12c0;
  int local_12b4;
  int local_12b0;
  int local_12ac;
  long *local_12a8;
  int local_129c;
  int local_1298;
  int local_1294;
  long *local_1290;
  int local_1284;
  int local_1280;
  int local_127c;
  long *local_1278;
  int local_126c;
  int local_1268;
  int local_1264;
  long *local_1260;
  int local_1254;
  int local_1250;
  int local_124c;
  long *local_1248;
  int local_123c;
  int local_1238;
  int local_1234;
  long *local_1230;
  int local_1224;
  int local_1220;
  int local_121c;
  long *local_1218;
  int local_120c;
  int local_1208;
  int local_1204;
  long *local_1200;
  int local_11f4;
  int local_11f0;
  int local_11ec;
  long *local_11e8;
  int local_11dc;
  int local_11d8;
  int local_11d4;
  long *local_11d0;
  int local_11c4;
  int local_11c0;
  int local_11bc;
  long *local_11b8;
  int local_11ac;
  int local_11a8;
  int local_11a4;
  long *local_11a0;
  int local_1194;
  int local_1190;
  int local_118c;
  long *local_1188;
  int local_117c;
  int local_1178;
  int local_1174;
  long *local_1170;
  int local_1164;
  int local_1160;
  int local_115c;
  long *local_1158;
  int local_114c;
  int local_1148;
  int local_1144;
  long *local_1140;
  int local_1134;
  int local_1130;
  int local_112c;
  long *local_1128;
  int local_111c;
  int local_1118;
  int local_1114;
  long *local_1110;
  int local_1104;
  int local_1100;
  int local_10fc;
  long *local_10f8;
  int local_10ec;
  int local_10e8;
  int local_10e4;
  long *local_10e0;
  int local_10d4;
  int local_10d0;
  int local_10cc;
  long *local_10c8;
  int local_10bc;
  int local_10b8;
  int local_10b4;
  long *local_10b0;
  int local_10a4;
  int local_10a0;
  int local_109c;
  long *local_1098;
  int local_108c;
  int local_1088;
  int local_1084;
  long *local_1080;
  int local_1074;
  int local_1070;
  int local_106c;
  long *local_1068;
  int local_105c;
  int local_1058;
  int local_1054;
  long *local_1050;
  int local_1044;
  int local_1040;
  int local_103c;
  long *local_1038;
  int local_102c;
  int local_1028;
  int local_1024;
  long *local_1020;
  int local_1014;
  int local_1010;
  int local_100c;
  long *local_1008;
  int local_ffc;
  int local_ff8;
  int local_ff4;
  long *local_ff0;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  long *local_fd8;
  int local_fcc;
  int local_fc8;
  int local_fc4;
  long *local_fc0;
  int local_fb4;
  int local_fb0;
  int local_fac;
  long *local_fa8;
  int local_f9c;
  int local_f98;
  int local_f94;
  long *local_f90;
  int local_f84;
  int local_f80;
  int local_f7c;
  long *local_f78;
  int local_f6c;
  int local_f68;
  int local_f64;
  long *local_f60;
  int local_f54;
  int local_f50;
  int local_f4c;
  long *local_f48;
  int local_f3c;
  int local_f38;
  int local_f34;
  long *local_f30;
  int local_f24;
  int local_f20;
  int local_f1c;
  long *local_f18;
  int local_f0c;
  int local_f08;
  int local_f04;
  long *local_f00;
  int local_ef4;
  int local_ef0;
  int local_eec;
  long *local_ee8;
  int local_edc;
  int local_ed8;
  int local_ed4;
  long *local_ed0;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  long *local_eb8;
  int local_eac;
  int local_ea8;
  int local_ea4;
  long *local_ea0;
  int local_e94;
  int local_e90;
  int local_e8c;
  long *local_e88;
  int local_e7c;
  int local_e78;
  int local_e74;
  long *local_e70;
  int local_e64;
  int local_e60;
  int local_e5c;
  long *local_e58;
  int local_e4c;
  int local_e48;
  int local_e44;
  long *local_e40;
  int local_e34;
  int local_e30;
  int local_e2c;
  long *local_e28;
  int local_e1c;
  int local_e18;
  int local_e14;
  long *local_e10;
  int local_e04;
  int local_e00;
  int local_dfc;
  long *local_df8;
  int local_dec;
  int local_de8;
  int local_de4;
  long *local_de0;
  int local_dd4;
  int local_dd0;
  int local_dcc;
  long *local_dc8;
  int local_dbc;
  int local_db8;
  int local_db4;
  long *local_db0;
  int local_da4;
  int local_da0;
  int local_d9c;
  long *local_d98;
  int local_d8c;
  int local_d88;
  int local_d84;
  long *local_d80;
  int local_d74;
  int local_d70;
  int local_d6c;
  long *local_d68;
  int local_d5c;
  int local_d58;
  int local_d54;
  long *local_d50;
  int local_d44;
  int local_d40;
  int local_d3c;
  long *local_d38;
  int local_d2c;
  int local_d28;
  int local_d24;
  long *local_d20;
  int local_d14;
  int local_d10;
  int local_d0c;
  long *local_d08;
  int local_cfc;
  int local_cf8;
  int local_cf4;
  long *local_cf0;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  long *local_cd8;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  long *local_cc0;
  int local_cb4;
  int local_cb0;
  int local_cac;
  long *local_ca8;
  int local_c9c;
  int local_c98;
  int local_c94;
  long *local_c90;
  int local_c84;
  int local_c80;
  int local_c7c;
  long *local_c78;
  int local_c6c;
  int local_c68;
  int local_c64;
  long *local_c60;
  int local_c54;
  int local_c50;
  int local_c4c;
  long *local_c48;
  int local_c3c;
  int local_c38;
  int local_c34;
  long *local_c30;
  int local_c24;
  int local_c20;
  int local_c1c;
  long *local_c18;
  int local_c0c;
  int local_c08;
  int local_c04;
  long *local_c00;
  int local_bf4;
  int local_bf0;
  int local_bec;
  long *local_be8;
  int local_bdc;
  int local_bd8;
  int local_bd4;
  long *local_bd0;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  long *local_bb8;
  int local_bac;
  int local_ba8;
  int local_ba4;
  long *local_ba0;
  int local_b94;
  int local_b90;
  int local_b8c;
  long *local_b88;
  int local_b7c;
  int local_b78;
  int local_b74;
  long *local_b70;
  int local_b64;
  int local_b60;
  int local_b5c;
  long *local_b58;
  int local_b4c;
  int local_b48;
  int local_b44;
  long *local_b40;
  int local_b34;
  int local_b30;
  int local_b2c;
  long *local_b28;
  int local_b1c;
  int local_b18;
  int local_b14;
  long *local_b10;
  int local_b04;
  int local_b00;
  int local_afc;
  long *local_af8;
  int local_aec;
  int local_ae8;
  int local_ae4;
  long *local_ae0;
  int local_ad4;
  int local_ad0;
  int local_acc;
  long *local_ac8;
  int local_abc;
  int local_ab8;
  int local_ab4;
  long *local_ab0;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  long *local_a98;
  int local_a8c;
  int local_a88;
  int local_a84;
  long *local_a80;
  int local_a74;
  int local_a70;
  int local_a6c;
  long *local_a68;
  int local_a5c;
  int local_a58;
  int local_a54;
  long *local_a50;
  int local_a44;
  int local_a40;
  int local_a3c;
  long *local_a38;
  int local_a2c;
  int local_a28;
  int local_a24;
  long *local_a20;
  int local_a14;
  int local_a10;
  int local_a0c;
  long *local_a08;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  long *local_9f0;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  long *local_9d8;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  long *local_9c0;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  Long *local_9a8;
  int local_99c;
  int local_998;
  int local_994;
  Long *local_990;
  int local_984;
  int local_980;
  int local_97c;
  Long *local_978;
  undefined4 local_96c;
  GpuArray<double,_3U> *local_968;
  undefined4 local_95c;
  GpuArray<double,_3U> *local_958;
  undefined4 local_94c;
  GpuArray<double,_3U> *local_948;
  undefined4 local_93c;
  GpuArray<double,_3U> *local_938;
  undefined4 local_92c;
  GpuArray<double,_3U> *local_928;
  undefined4 local_91c;
  GpuArray<double,_3U> *local_918;
  undefined4 local_90c;
  GpuArray<double,_3U> *local_908;
  undefined4 local_8fc;
  GpuArray<double,_3U> *local_8f8;
  undefined4 local_8ec;
  GpuArray<double,_3U> *local_8e8;
  undefined4 local_8dc;
  GpuArray<double,_3U> *local_8d8;
  undefined4 local_8cc;
  GpuArray<double,_3U> *local_8c8;
  undefined4 local_8bc;
  GpuArray<double,_3U> *local_8b8;
  undefined4 local_8ac;
  GpuArray<double,_3U> *local_8a8;
  undefined4 local_89c;
  GpuArray<double,_3U> *local_898;
  undefined4 local_88c;
  GpuArray<double,_3U> *local_888;
  undefined4 local_87c;
  GpuArray<double,_3U> *local_878;
  undefined4 local_86c;
  GpuArray<double,_3U> *local_868;
  undefined4 local_85c;
  GpuArray<double,_3U> *local_858;
  undefined4 local_84c;
  GpuArray<double,_3U> *local_848;
  undefined4 local_83c;
  GpuArray<double,_3U> *local_838;
  undefined4 local_82c;
  GpuArray<double,_3U> *local_828;
  undefined4 local_81c;
  GpuArray<double,_3U> *local_818;
  undefined4 local_80c;
  GpuArray<double,_3U> *local_808;
  undefined4 local_7fc;
  GpuArray<double,_3U> *local_7f8;
  undefined4 local_7ec;
  GpuArray<double,_3U> *local_7e8;
  undefined4 local_7dc;
  GpuArray<double,_3U> *local_7d8;
  undefined4 local_7cc;
  GpuArray<double,_3U> *local_7c8;
  undefined4 local_7bc;
  GpuArray<double,_3U> *local_7b8;
  undefined4 local_7ac;
  GpuArray<double,_3U> *local_7a8;
  undefined4 local_79c;
  GpuArray<double,_3U> *local_798;
  undefined4 local_78c;
  GpuArray<double,_3U> *local_788;
  undefined4 local_77c;
  GpuArray<double,_3U> *local_778;
  undefined4 local_76c;
  GpuArray<double,_3U> *local_768;
  undefined4 local_75c;
  GpuArray<double,_3U> *local_758;
  undefined4 local_74c;
  GpuArray<double,_3U> *local_748;
  undefined4 local_73c;
  GpuArray<double,_3U> *local_738;
  undefined4 local_72c;
  GpuArray<double,_3U> *local_728;
  undefined4 local_71c;
  GpuArray<double,_3U> *local_718;
  undefined4 local_70c;
  GpuArray<double,_3U> *local_708;
  undefined4 local_6fc;
  GpuArray<double,_3U> *local_6f8;
  undefined4 local_6ec;
  GpuArray<double,_3U> *local_6e8;
  undefined4 local_6dc;
  GpuArray<double,_3U> *local_6d8;
  undefined4 local_6cc;
  GpuArray<double,_3U> *local_6c8;
  undefined4 local_6bc;
  GpuArray<double,_3U> *local_6b8;
  undefined4 local_6ac;
  GpuArray<double,_3U> *local_6a8;
  undefined4 local_69c;
  GpuArray<double,_3U> *local_698;
  undefined4 local_68c;
  GpuArray<double,_3U> *local_688;
  undefined4 local_67c;
  GpuArray<double,_3U> *local_678;
  undefined4 local_66c;
  GpuArray<double,_3U> *local_668;
  undefined4 local_65c;
  GpuArray<double,_3U> *local_658;
  undefined4 local_64c;
  GpuArray<double,_3U> *local_648;
  undefined4 local_63c;
  GpuArray<double,_3U> *local_638;
  undefined4 local_62c;
  GpuArray<double,_3U> *local_628;
  undefined4 local_61c;
  GpuArray<double,_3U> *local_618;
  char *local_610;
  char *local_608;
  int local_5fc;
  double *local_5f8;
  int local_5ec;
  double *local_5e8;
  int local_5dc;
  double *local_5d8;
  int local_5cc;
  double *local_5c8;
  int local_5bc;
  double *local_5b8;
  int local_5ac;
  double *local_5a8;
  int local_59c;
  double *local_598;
  int local_58c;
  double *local_588;
  int local_57c;
  double *local_578;
  int local_56c;
  double *local_568;
  int local_55c;
  double *local_558;
  int local_54c;
  double *local_548;
  int local_53c;
  double *local_538;
  int local_52c;
  double *local_528;
  int local_51c;
  double *local_518;
  int local_50c;
  double *local_508;
  int local_4fc;
  double *local_4f8;
  int local_4ec;
  double *local_4e8;
  int local_4dc;
  double *local_4d8;
  int local_4cc;
  double *local_4c8;
  int local_4bc;
  double *local_4b8;
  int local_4ac;
  double *local_4a8;
  int local_49c;
  double *local_498;
  int local_48c;
  double *local_488;
  int local_47c;
  double *local_478;
  int local_46c;
  double *local_468;
  int local_45c;
  double *local_458;
  int local_44c;
  double *local_448;
  int local_43c;
  double *local_438;
  int local_42c;
  double *local_428;
  int local_41c;
  double *local_418;
  int local_40c;
  double *local_408;
  int local_3fc;
  double *local_3f8;
  int local_3f0;
  int local_3ec;
  double local_3e8;
  int local_3dc;
  undefined1 *local_3d8;
  double *local_3d0;
  double *local_3c8;
  double *local_3c0;
  double *local_3b8;
  double *local_3b0;
  char *local_3a8;
  int local_39c;
  double *local_398;
  int local_38c;
  double *local_388;
  int local_37c;
  undefined1 *local_378;
  int local_36c;
  double *local_368;
  int local_35c;
  double *local_358;
  int local_34c;
  double *local_348;
  int local_33c;
  double *local_338;
  int local_32c;
  double *local_328;
  int local_31c;
  undefined1 *local_318;
  int local_30c;
  double *local_308;
  int local_2fc;
  double *local_2f8;
  int local_2ec;
  undefined1 *local_2e8;
  int local_2dc;
  double *local_2d8;
  undefined4 local_2cc;
  double *local_2c8;
  undefined4 local_2bc;
  double *local_2b8;
  undefined4 local_2ac;
  double *local_2a8;
  int local_2a0;
  int local_29c;
  double local_298;
  int local_28c;
  undefined1 *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  char *local_258;
  int local_24c;
  double *local_248;
  int local_23c;
  double *local_238;
  int local_22c;
  undefined1 *local_228;
  int local_21c;
  double *local_218;
  int local_20c;
  double *local_208;
  int local_1fc;
  double *local_1f8;
  int local_1ec;
  double *local_1e8;
  int local_1dc;
  double *local_1d8;
  int local_1cc;
  undefined1 *local_1c8;
  int local_1bc;
  double *local_1b8;
  int local_1ac;
  double *local_1a8;
  int local_19c;
  undefined1 *local_198;
  int local_18c;
  double *local_188;
  undefined4 local_17c;
  double *local_178;
  undefined4 local_16c;
  double *local_168;
  undefined4 local_15c;
  double *local_158;
  int local_150;
  int local_14c;
  double local_148;
  int local_13c;
  undefined1 *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  char *local_108;
  int local_fc;
  double *local_f8;
  int local_ec;
  double *local_e8;
  int local_dc;
  undefined1 *local_d8;
  int local_cc;
  double *local_c8;
  int local_bc;
  double *local_b8;
  int local_ac;
  double *local_a8;
  int local_9c;
  double *local_98;
  int local_8c;
  double *local_88;
  int local_7c;
  undefined1 *local_78;
  int local_6c;
  double *local_68;
  int local_5c;
  double *local_58;
  int local_4c;
  undefined1 *local_48;
  int local_3c;
  double *local_38;
  undefined4 local_2c;
  double *local_28;
  undefined4 local_1c;
  double *local_18;
  undefined4 local_c;
  double *local_8;
  
  local_3800 = in_RCX;
  local_37f8 = in_EDX;
  local_37f4 = in_ESI;
  Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  local_3810 = Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
               ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                             *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  local_3818 = Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                             *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  CoordSys::InvCellSizeArray(&local_3830,&this_00->super_CoordSys);
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  local_3838 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                         ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                          in_stack_ffffffffffffb660);
  local_3839 = true;
  if ((local_37f4 == 0) && (0 < local_37f8)) {
    local_37e0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                           ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                            in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
    local_37e4 = 2;
    local_4929 = false;
    if ((local_37e0->vect[0] == 2) && (local_4929 = false, local_37e0->vect[1] == 2)) {
      local_4929 = local_37e0->vect[2] == 2;
    }
    local_3839 = local_4929;
  }
  std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
  operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
  bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_ffffffffffffb660,in_stack_ffffffffffffb658);
  if ((bVar1) && ((local_3839 & 1U) == 0)) {
    local_37c0 = "regular_coarsening";
    local_37c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
    ;
    local_37cc = 0x1a9;
    local_37d8 = 0;
    Assert_host((char *)in_stack_ffffffffffffb890,(char *)in_stack_ffffffffffffb888,
                in_stack_ffffffffffffb884,(char *)in_stack_ffffffffffffb878);
  }
  if ((*(byte *)(in_RDI + 0x640) & 1) == 0) {
    this_01 = FabArrayBase::boxArray(local_3800);
    bxs = (BoxArray *)FabArrayBase::DistributionMap(local_3800);
    local_40f8.msk.kstride = 0;
    local_40f8.msk.nstride = 0;
    local_40f8.msk.p = (int *)0x0;
    local_40f8.msk.jstride = 0;
    local_40f8.msk.begin.x = 0;
    local_40f8.msk.begin.y = 0;
    f = &local_40f8;
    MFInfo::MFInfo((MFInfo *)0x148fd2b);
    local_4100 = (undefined1  [8])0x0;
    __n = (FabArrayBase *)local_4100;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffb660);
    fabarray_ = __n;
    MultiFab::MultiFab((MultiFab *)f,bxs,(DistributionMapping *)this_01,(int)((ulong)__n >> 0x20),
                       (int)__n,in_stack_ffffffffffffb680,in_stack_ffffffffffffb6b0);
    do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffb680 >> 0x38);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x148fd87);
    MFInfo::~MFInfo((MFInfo *)0x148fd94);
    Fapply(in_stack_ffffffffffffba20,in_stack_ffffffffffffba1c,in_stack_ffffffffffffba18,
           in_stack_ffffffffffffba10,in_stack_ffffffffffffba08);
    if (*(int *)(in_RDI + 0x560) == 1) {
      MFIter::MFIter((MFIter *)this_01,fabarray_,(bool)do_tiling_);
      while (bVar1 = MFIter::isValid(&local_4170), bVar1) {
        MFIter::tilebox(in_stack_ffffffffffffb6c0);
        local_4178 = local_4194;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_41a0 = local_41e0;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_41e8 = local_4228;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_4230 = local_4270;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x148ff29);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_4278 = local_42b8;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_42c0 = local_4300;
        local_2880 = local_4178;
        local_2888 = local_41a0;
        local_2890 = local_41e8;
        local_2898 = local_4230;
        local_28a0 = local_4278;
        local_28a8 = local_42c0;
        memcpy(local_29e8,local_42c0,0x3c);
        memcpy(auStack_29a8,local_2888,0x3c);
        memcpy(auStack_2968,local_28a0,0x3c);
        memcpy(auStack_2928,local_2898,0x3c);
        memcpy(auStack_28e8,local_2890,0x3c);
        LoopConcurrent<amrex::mlndlap_jacobi_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                  (in_stack_ffffffffffffb6a8,(anon_class_320_5_f501ae73 *)f);
        MFIter::operator++(&local_4170);
      }
      MFIter::~MFIter(in_stack_ffffffffffffb660);
    }
    else {
      std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
      operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                  *)in_stack_ffffffffffffb660,(size_type)__n);
      bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              in_stack_ffffffffffffb660,__n);
      if (bVar1) {
        local_4308 = *(undefined8 *)(in_RDI + 0x578);
        MFIter::MFIter((MFIter *)this_01,fabarray_,(bool)do_tiling_);
        while (bVar1 = MFIter::isValid(&local_4368), bVar1) {
          MFIter::tilebox(in_stack_ffffffffffffb6c0);
          local_4370 = local_438c;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4398 = local_43d8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_43e0 = local_4420;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4428 = local_4468;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4470 = local_44b0;
          local_2730 = local_4370;
          local_2738 = local_4398;
          local_2740 = local_43e0;
          local_2748 = local_4428;
          local_2750 = local_4308;
          local_2760 = &local_3830;
          local_85c = 0;
          local_86c = 0;
          local_87c = 1;
          local_88c = 1;
          local_89c = 2;
          local_8ac = 2;
          local_2768 = (local_3830.arr[2] * local_3830.arr[2] +
                       local_3830.arr[0] * local_3830.arr[0] + local_3830.arr[1] * local_3830.arr[1]
                       ) * -0.1111111111111111;
          local_2758 = local_4470;
          local_8a8 = local_2760;
          local_898 = local_2760;
          local_888 = local_2760;
          local_878 = local_2760;
          local_868 = local_2760;
          local_858 = local_2760;
          memcpy(local_2878,local_4470,0x3c);
          memcpy(auStack_2838,local_2738,0x3c);
          memcpy(auStack_27f8,local_2748,0x3c);
          memcpy(auStack_27b8,local_2740,0x3c);
          local_2778 = local_2768;
          local_2770 = local_2750;
          LoopConcurrent<amrex::mlndlap_jacobi_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    (in_stack_ffffffffffffb6a8,(anon_class_272_6_f7bd19c5 *)f);
          MFIter::operator++(&local_4368);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
      else if ((((*(byte *)(in_RDI + 0x641) & 1) == 0) || (local_37f8 < 1)) &&
              ((*(byte *)(in_RDI + 0x642) & 1) == 0)) {
        MFIter::MFIter((MFIter *)this_01,fabarray_,(bool)do_tiling_);
        while (bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffb870), bVar1) {
          MFIter::tilebox(in_stack_ffffffffffffb6c0);
          local_4798 = &stack0xffffffffffffb84c;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)__n);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1490a4d
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_47c0 = local_4800;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4808 = local_4848;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4850 = local_4890;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4898 = local_48d8;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_48e0 = local_4920;
          local_2370 = (FabArray<amrex::FArrayBox> *)local_4798;
          local_2378 = local_4808;
          local_2380 = local_4850;
          local_2388 = local_4898;
          local_2390 = local_47c0;
          local_23a0 = &local_3830;
          local_91c = 0;
          local_92c = 0;
          local_93c = 1;
          local_94c = 1;
          local_95c = 2;
          local_96c = 2;
          local_23a8 = (local_3830.arr[2] * local_3830.arr[2] +
                       local_3830.arr[0] * local_3830.arr[0] + local_3830.arr[1] * local_3830.arr[1]
                       ) * -0.1111111111111111;
          in_stack_ffffffffffffb668 = local_4798;
          local_2398 = local_48e0;
          local_968 = local_23a0;
          local_958 = local_23a0;
          local_948 = local_23a0;
          local_938 = local_23a0;
          local_928 = local_23a0;
          local_918 = local_23a0;
          memcpy(local_24f0,local_48e0,0x3c);
          memcpy(auStack_24b0,local_2378,0x3c);
          memcpy(auStack_2470,local_2388,0x3c);
          memcpy(auStack_2430,local_2380,0x3c);
          local_23f0 = local_23a8;
          memcpy(auStack_23e8,local_2390,0x3c);
          LoopConcurrent<amrex::mlndlap_jacobi_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    (in_stack_ffffffffffffb6a8,(anon_class_328_6_f7bd19c5 *)f);
          MFIter::operator++((MFIter *)&stack0xffffffffffffb870);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
      else {
        MFIter::MFIter((MFIter *)this_01,fabarray_,(bool)do_tiling_);
        while (bVar1 = MFIter::isValid(&local_4510), bVar1) {
          MFIter::tilebox(in_stack_ffffffffffffb6c0);
          local_4518 = local_4534;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)__n);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1490542
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4540 = local_4580;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)__n);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1490584
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4588 = local_45c8;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)__n);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14905c6
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4618 = local_4658;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_4660 = local_46a0;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_46a8 = local_46e8;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_46f0 = local_4730;
          local_24f8 = local_4518;
          local_2500 = local_4618;
          local_2508 = local_4660;
          local_2510 = local_46a8;
          local_2518 = local_4540;
          local_2520 = local_4588;
          local_2538 = &local_3830;
          local_8bc = 0;
          local_8cc = 0;
          local_2540 = local_3830.arr[0] * -0.1111111111111111 * local_3830.arr[0];
          local_8dc = 1;
          local_8ec = 1;
          local_2548 = local_3830.arr[1] * -0.1111111111111111 * local_3830.arr[1];
          local_8fc = 2;
          local_90c = 2;
          local_2550 = local_3830.arr[2] * -0.1111111111111111 * local_3830.arr[2];
          local_2530 = local_46f0;
          local_2528 = local_4610;
          local_908 = local_2538;
          local_8f8 = local_2538;
          local_8e8 = local_2538;
          local_8d8 = local_2538;
          local_8c8 = local_2538;
          local_8b8 = local_2538;
          memcpy(local_2728,local_46f0,0x3c);
          memcpy(auStack_26e8,local_2500,0x3c);
          memcpy(auStack_26a8,local_2510,0x3c);
          memcpy(auStack_2668,local_2508,0x3c);
          local_2628 = local_2540;
          memcpy(auStack_2620,local_2518,0x3c);
          local_25e0 = local_2548;
          memcpy(auStack_25d8,local_2520,0x3c);
          local_2598 = local_2550;
          memcpy(auStack_2590,local_2528,0x3c);
          LoopConcurrent<amrex::mlndlap_jacobi_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    (in_stack_ffffffffffffb6a8,f);
          MFIter::operator++(&local_4510);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
    }
    MultiFab::~MultiFab((MultiFab *)0x1490dcf);
  }
  else {
    if (*(int *)(in_RDI + 0x560) == 1) {
      MFIter::MFIter((MFIter *)in_stack_ffffffffffffb690,in_stack_ffffffffffffb688,
                     (uchar)((ulong)in_stack_ffffffffffffb680 >> 0x38));
      while (bVar1 = MFIter::isValid(&local_38a0), bVar1) {
        MFIter::validbox(in_stack_ffffffffffffb670);
        local_38a8 = local_38c4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_38d0 = local_3910;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_3918 = local_3958;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14834cf);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_3960 = local_39a0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,in_stack_ffffffffffffb660
                  );
        local_39a8 = local_39e8;
        for (local_39ec = 0; local_39ec < *(int *)(in_RDI + 0x568); local_39ec = local_39ec + 1) {
          local_3698 = local_38a8;
          local_36a0 = local_38d0;
          local_36a8 = local_3918;
          local_36b0 = local_3960;
          local_36b8 = local_39a8;
          memcpy(local_37b8,local_39a8,0x3c);
          memcpy(auStack_3778,local_36a0,0x3c);
          memcpy(auStack_3738,local_36b0,0x3c);
          memcpy(auStack_36f8,local_36a8,0x3c);
          LoopConcurrent<amrex::mlndlap_gauss_seidel_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                    (in_stack_ffffffffffffb6a8,
                     (anon_class_256_4_a2b17762 *)in_stack_ffffffffffffb6a0);
        }
        MFIter::operator++(&local_38a0);
      }
      MFIter::~MFIter(in_stack_ffffffffffffb660);
    }
    else {
      std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
      operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                  *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
      bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              in_stack_ffffffffffffb660,in_stack_ffffffffffffb658);
      flags_ = (uchar)((ulong)in_stack_ffffffffffffb680 >> 0x38);
      if (bVar1) {
        local_39f8 = *(undefined8 *)(in_RDI + 0x578);
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffb690,in_stack_ffffffffffffb688,flags_);
        while (bVar1 = MFIter::isValid(&local_3a58), bVar1) {
          MFIter::validbox(in_stack_ffffffffffffb670);
          local_3a60 = local_3a7c;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3a88 = local_3ac8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3ad0 = local_3b10;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3b18 = local_3b58;
          for (local_3b5c = 0; local_3b5c < *(int *)(in_RDI + 0x568); local_3b5c = local_3b5c + 1) {
            local_3518 = local_3a60;
            local_3520 = local_3a88;
            local_3528 = local_3ad0;
            local_3530 = local_39f8;
            local_3538 = local_3b18;
            local_3540 = &local_3830;
            local_61c = 0;
            local_62c = 0;
            local_3548 = local_3830.arr[0] * 0.027777777777777776 * local_3830.arr[0];
            local_63c = 1;
            local_64c = 1;
            local_3550 = local_3830.arr[1] * 0.027777777777777776 * local_3830.arr[1];
            local_65c = 2;
            local_66c = 2;
            local_3558 = local_3830.arr[2] * 0.027777777777777776 * local_3830.arr[2];
            local_3560 = local_3548 + local_3550 + local_3558;
            local_3568 = local_3558 + local_3558 + local_3550 + local_3550 + -local_3548;
            local_3570 = local_3558 + local_3558 + local_3548 + local_3548 + -local_3550;
            local_3578 = (local_3548 + local_3548 + local_3550 * 2.0) - local_3558;
            local_3580 = (local_3548 * 4.0 + -(local_3550 * 2.0)) - (local_3558 + local_3558);
            local_3588 = (local_3550 * 4.0 - (local_3548 + local_3548)) - (local_3558 + local_3558);
            local_3590 = local_3558 * 4.0 + (-(local_3550 * 2.0) - (local_3548 + local_3548));
            local_668 = local_3540;
            local_658 = local_3540;
            local_648 = local_3540;
            local_638 = local_3540;
            local_628 = local_3540;
            local_618 = local_3540;
            memcpy(local_3690,local_3b18,0x3c);
            memcpy(auStack_3650,local_3520,0x3c);
            local_3610 = local_3560;
            local_3608 = local_3568;
            local_3600 = local_3570;
            local_35f8 = local_3578;
            local_35f0 = local_3580;
            local_35e8 = local_3588;
            local_35e0 = local_3590;
            memcpy(auStack_35d8,local_3528,0x3c);
            local_3598 = local_3530;
            Loop<amrex::mlndlap_gauss_seidel_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                      (in_stack_ffffffffffffb6a8,
                       (anon_class_256_11_43b85e95 *)in_stack_ffffffffffffb6a0);
          }
          MFIter::operator++(&local_3a58);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
      else if ((((*(byte *)(in_RDI + 0x641) & 1) == 0) || (local_37f8 < 1)) &&
              ((*(byte *)(in_RDI + 0x642) & 1) == 0)) {
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffb690,in_stack_ffffffffffffb688,flags_);
        while (bVar1 = MFIter::isValid(&local_3e00), bVar1) {
          MFIter::validbox(in_stack_ffffffffffffb670);
          local_3e08 = &local_3e24;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1484205
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3e30 = local_3e70;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3e78 = local_3eb8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3ec0 = local_3f00;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3f08 = &local_40f8.sz.nstride;
          if ((local_3839 & 1U) == 0) {
            for (local_40f8.sz.kstride._0_4_ = 0;
                (int)local_40f8.sz.kstride < *(int *)(in_RDI + 0x568);
                local_40f8.sz.kstride._0_4_ = (int)local_40f8.sz.kstride + 1) {
              local_2a40 = local_3e08;
              local_2a48 = local_3e78;
              local_2a50 = local_3ec0;
              local_2a58 = local_3e30;
              local_2a60 = local_3f08;
              local_2a68 = &local_3830;
              local_73c = 0;
              local_74c = 0;
              local_2a70 = local_3830.arr[0] * 0.027777777777777776 * local_3830.arr[0];
              local_75c = 1;
              local_76c = 1;
              local_2a78 = local_3830.arr[1] * 0.027777777777777776 * local_3830.arr[1];
              local_77c = 2;
              local_78c = 2;
              local_2a80 = local_3830.arr[2] * 0.027777777777777776 * local_3830.arr[2];
              local_2a88 = local_2a70 + local_2a78 + local_2a80;
              local_2a90 = local_2a80 + local_2a80 + ((local_2a78 + local_2a78) - local_2a70);
              local_2a98 = local_2a80 + local_2a80 + ((local_2a70 + local_2a70) - local_2a78);
              local_2aa0 = (local_2a70 + local_2a70 + local_2a78 + local_2a78) - local_2a80;
              local_2aa8 = (local_2a70 * 4.0 - (local_2a78 + local_2a78)) -
                           (local_2a80 + local_2a80);
              local_2ab0 = (local_2a78 * 4.0 - (local_2a70 + local_2a70)) -
                           (local_2a80 + local_2a80);
              local_2ab8 = local_2a80 * 4.0 + (local_2a70 * -2.0 - (local_2a78 + local_2a78));
              local_2a28 = local_3e08;
              local_2310 = local_3e08;
              local_2314 = 0;
              local_2a1c = (local_3e08->smallend).vect[0];
              local_2320 = local_3e08;
              local_2324 = 1;
              iStack_2a18 = (local_3e08->smallend).vect[1];
              local_2ad8 = *(undefined8 *)(local_3e08->smallend).vect;
              local_2330 = local_3e08;
              local_2334 = 2;
              local_2ad0 = (local_3e08->smallend).vect[2];
              local_2a00 = local_3e08;
              local_2340 = &local_3e08->bigend;
              local_2344 = 0;
              local_29f4 = local_2340->vect[0];
              local_2350 = &local_3e08->bigend;
              local_2354 = 1;
              iStack_29f0 = (local_3e08->bigend).vect[1];
              local_2af8 = *(undefined8 *)local_2340->vect;
              local_2360 = &local_3e08->bigend;
              local_2364 = 2;
              local_2af0 = (local_3e08->bigend).vect[2];
              local_2afc = -1;
              local_2b00 = 0x21;
              local_79c = 0;
              local_7ac = 2;
              if (local_3830.arr[0] <= local_3830.arr[2]) {
                local_83c = 1;
                local_84c = 2;
                local_848 = local_2a68;
                local_838 = local_2a68;
                if (local_3830.arr[1] <= local_3830.arr[2]) {
                  local_2afc = 2;
                  local_2b00 = (local_2af0 - local_2ad0) + 1;
                }
              }
              local_7bc = 0;
              local_7cc = 1;
              if (local_3830.arr[0] <= local_3830.arr[1]) {
                local_81c = 2;
                local_82c = 1;
                local_828 = local_2a68;
                local_818 = local_2a68;
                if (local_3830.arr[2] <= local_3830.arr[1]) {
                  local_2afc = 1;
                  local_2b00 = (iStack_29f0 - iStack_2a18) + 1;
                }
              }
              local_7dc = 1;
              local_7ec = 0;
              if (local_3830.arr[1] <= local_3830.arr[0]) {
                local_7fc = 2;
                local_80c = 0;
                local_808 = local_2a68;
                local_7f8 = local_2a68;
                if (local_3830.arr[2] <= local_3830.arr[0]) {
                  local_2afc = 0;
                  local_2b00 = (local_29f4 - local_2a1c) + 1;
                }
              }
              local_2ae4 = local_2af8;
              local_2adc = local_2af0;
              local_2ac8 = local_2ad8;
              local_2ac0 = local_2ad0;
              local_2a38 = local_2ad8;
              local_2a30 = local_2ad0;
              local_2a14 = local_2ad0;
              local_2a10 = local_2af8;
              local_2a08 = local_2af0;
              local_29ec = local_2af0;
              local_7e8 = local_2a68;
              local_7d8 = local_2a68;
              local_7c8 = local_2a68;
              local_7b8 = local_2a68;
              local_7a8 = local_2a68;
              local_798 = local_2a68;
              local_788 = local_2a68;
              local_778 = local_2a68;
              local_768 = local_2a68;
              local_758 = local_2a68;
              local_748 = local_2a68;
              local_738 = local_2a68;
              if (0x20 < local_2b00) {
                local_608 = 
                "mlndlap_gauss_seidel_with_line_solve_aa is hard-wired to be no longer than 32";
                Abort_host((char *)in_stack_ffffffffffffb670);
              }
              if (local_2afc == 2) {
                for (local_3104 = local_2ac8._4_4_; local_3104 <= local_2ae4._4_4_;
                    local_3104 = local_3104 + 1) {
                  for (local_3108 = (int)local_2ac8; local_3108 <= (int)local_2ae4;
                      local_3108 = local_3108 + 1) {
                    for (local_310c = local_2ac0; local_310c <= local_2adc;
                        local_310c = local_310c + 1) {
                      local_9a8 = local_2a60;
                      local_9ac = local_3108;
                      local_9b0 = local_3104;
                      local_9b4 = local_310c;
                      if (*(int *)(*local_2a60 +
                                  ((long)(local_3108 - *(int *)(local_2a60 + 4)) +
                                   (long)(local_3104 - *(int *)((long)local_2a60 + 0x24)) *
                                   *(long *)(local_2a60 + 1) +
                                  (long)(local_310c - (int)local_2a60[5]) * local_2a60[2]) * 4) == 0
                         ) {
                        local_15f4 = local_3108 + -1;
                        local_15f8 = local_3104 + -1;
                        local_15fc = local_310c + -1;
                        local_15f0 = local_2a58;
                        local_1610 = local_3104 + -1;
                        local_1614 = local_310c + -1;
                        local_1608 = local_2a58;
                        local_160c = local_3108;
                        local_1624 = local_3108 + -1;
                        local_162c = local_310c + -1;
                        local_1620 = local_2a58;
                        local_1628 = local_3104;
                        local_1644 = local_310c + -1;
                        local_1638 = local_2a58;
                        local_163c = local_3108;
                        local_1640 = local_3104;
                        local_1654 = local_3108 + -1;
                        local_1658 = local_3104 + -1;
                        local_1650 = local_2a58;
                        local_165c = local_310c;
                        local_1670 = local_3104 + -1;
                        local_1668 = local_2a58;
                        local_166c = local_3108;
                        local_1674 = local_310c;
                        local_1684 = local_3108 + -1;
                        local_1680 = local_2a58;
                        local_1688 = local_3104;
                        local_168c = local_310c;
                        local_1698 = local_2a58;
                        local_169c = local_3108;
                        local_16a0 = local_3104;
                        local_16a4 = local_310c;
                        local_3118 = local_2a88 * -4.0 *
                                     (*(double *)
                                       (*local_2a58 +
                                       ((long)(local_15f4 - (int)local_2a58[4]) +
                                        (long)(local_15f8 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_15fc - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_1610 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1614 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1624 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_162c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_3108 - (int)local_2a58[4]) +
                                        (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_1644 - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_1654 - (int)local_2a58[4]) +
                                          (long)(local_1658 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_1670 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_1684 - (int)local_2a58[4]) +
                                        (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                     + *(double *)
                                        (*local_2a58 +
                                        ((long)(local_3108 - (int)local_2a58[4]) +
                                         (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                         local_2a58[1] +
                                        (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                        ));
                        local_20d4 = local_3108 + -1;
                        local_20d8 = local_3104 + -1;
                        local_20dc = local_310c + -1;
                        local_20d0 = local_2a48;
                        local_16b4 = local_3108 + -1;
                        local_16b8 = local_3104 + -1;
                        local_16bc = local_310c + -1;
                        local_16b0 = local_2a58;
                        local_20ec = local_3108 + 1;
                        local_20f0 = local_3104 + -1;
                        local_20f4 = local_310c + -1;
                        local_20e8 = local_2a48;
                        local_16d0 = local_3104 + -1;
                        local_16d4 = local_310c + -1;
                        local_16c8 = local_2a58;
                        local_16cc = local_3108;
                        local_2104 = local_3108 + -1;
                        local_2108 = local_3104 + 1;
                        local_210c = local_310c + -1;
                        local_2100 = local_2a48;
                        local_16e4 = local_3108 + -1;
                        local_16ec = local_310c + -1;
                        local_16e0 = local_2a58;
                        local_16e8 = local_3104;
                        local_211c = local_3108 + 1;
                        local_2120 = local_3104 + 1;
                        local_2124 = local_310c + -1;
                        local_2118 = local_2a48;
                        local_1704 = local_310c + -1;
                        local_16f8 = local_2a58;
                        local_16fc = local_3108;
                        local_1700 = local_3104;
                        local_2134 = local_3108 + -1;
                        local_2138 = local_3104 + -1;
                        local_213c = local_310c + 1;
                        local_2130 = local_2a48;
                        local_1714 = local_3108 + -1;
                        local_1718 = local_3104 + -1;
                        local_1710 = local_2a58;
                        local_171c = local_310c;
                        local_214c = local_3108 + 1;
                        local_2150 = local_3104 + -1;
                        local_2154 = local_310c + 1;
                        local_2148 = local_2a48;
                        local_1730 = local_3104 + -1;
                        local_1728 = local_2a58;
                        local_172c = local_3108;
                        local_1734 = local_310c;
                        local_2164 = local_3108 + -1;
                        local_2168 = local_3104 + 1;
                        local_216c = local_310c + 1;
                        local_2160 = local_2a48;
                        local_1744 = local_3108 + -1;
                        local_1740 = local_2a58;
                        local_1748 = local_3104;
                        local_174c = local_310c;
                        local_217c = local_3108 + 1;
                        local_2180 = local_3104 + 1;
                        local_2184 = local_310c + 1;
                        local_2178 = local_2a48;
                        local_1758 = local_2a58;
                        local_175c = local_3108;
                        local_1760 = local_3104;
                        local_1764 = local_310c;
                        local_2198 = local_3104 + -1;
                        local_219c = local_310c + -1;
                        local_2190 = local_2a48;
                        local_2194 = local_3108;
                        local_1774 = local_3108 + -1;
                        local_1778 = local_3104 + -1;
                        local_177c = local_310c + -1;
                        local_1770 = local_2a58;
                        local_1790 = local_3104 + -1;
                        local_1794 = local_310c + -1;
                        local_1788 = local_2a58;
                        local_178c = local_3108;
                        local_21b0 = local_3104 + 1;
                        local_21b4 = local_310c + -1;
                        local_21a8 = local_2a48;
                        local_21ac = local_3108;
                        local_17a4 = local_3108 + -1;
                        local_17ac = local_310c + -1;
                        local_17a0 = local_2a58;
                        local_17a8 = local_3104;
                        local_17c4 = local_310c + -1;
                        local_17b8 = local_2a58;
                        local_17bc = local_3108;
                        local_17c0 = local_3104;
                        local_21c8 = local_3104 + -1;
                        local_21cc = local_310c + 1;
                        local_21c0 = local_2a48;
                        local_21c4 = local_3108;
                        local_17d4 = local_3108 + -1;
                        local_17d8 = local_3104 + -1;
                        local_17d0 = local_2a58;
                        local_17dc = local_310c;
                        local_17f0 = local_3104 + -1;
                        local_17e8 = local_2a58;
                        local_17ec = local_3108;
                        local_17f4 = local_310c;
                        local_21e0 = local_3104 + 1;
                        local_21e4 = local_310c + 1;
                        local_21d8 = local_2a48;
                        local_21dc = local_3108;
                        local_1804 = local_3108 + -1;
                        local_1800 = local_2a58;
                        local_1808 = local_3104;
                        local_180c = local_310c;
                        local_1818 = local_2a58;
                        local_181c = local_3108;
                        local_1820 = local_3104;
                        local_1824 = local_310c;
                        local_21f4 = local_3108 + -1;
                        local_21fc = local_310c + -1;
                        local_21f0 = local_2a48;
                        local_21f8 = local_3104;
                        local_1834 = local_3108 + -1;
                        local_1838 = local_3104 + -1;
                        local_183c = local_310c + -1;
                        local_1830 = local_2a58;
                        local_184c = local_3108 + -1;
                        local_1854 = local_310c + -1;
                        local_1848 = local_2a58;
                        local_1850 = local_3104;
                        local_220c = local_3108 + 1;
                        local_2214 = local_310c + -1;
                        local_2208 = local_2a48;
                        local_2210 = local_3104;
                        local_1868 = local_3104 + -1;
                        local_186c = local_310c + -1;
                        local_1860 = local_2a58;
                        local_1864 = local_3108;
                        local_1884 = local_310c + -1;
                        local_1878 = local_2a58;
                        local_187c = local_3108;
                        local_1880 = local_3104;
                        local_2224 = local_3108 + -1;
                        local_222c = local_310c + 1;
                        local_2220 = local_2a48;
                        local_2228 = local_3104;
                        local_1894 = local_3108 + -1;
                        local_1898 = local_3104 + -1;
                        local_1890 = local_2a58;
                        local_189c = local_310c;
                        local_18ac = local_3108 + -1;
                        local_18a8 = local_2a58;
                        local_18b0 = local_3104;
                        local_18b4 = local_310c;
                        local_223c = local_3108 + 1;
                        local_2244 = local_310c + 1;
                        local_2238 = local_2a48;
                        local_2240 = local_3104;
                        local_18c8 = local_3104 + -1;
                        local_18c0 = local_2a58;
                        local_18c4 = local_3108;
                        local_18cc = local_310c;
                        local_18d8 = local_2a58;
                        local_18dc = local_3108;
                        local_18e0 = local_3104;
                        local_18e4 = local_310c;
                        local_2254 = local_3108 + -1;
                        local_2258 = local_3104 + -1;
                        local_2250 = local_2a48;
                        local_225c = local_310c;
                        local_18f4 = local_3108 + -1;
                        local_18f8 = local_3104 + -1;
                        local_18fc = local_310c + -1;
                        local_18f0 = local_2a58;
                        local_190c = local_3108 + -1;
                        local_1910 = local_3104 + -1;
                        local_1908 = local_2a58;
                        local_1914 = local_310c;
                        local_226c = local_3108 + 1;
                        local_2270 = local_3104 + -1;
                        local_2268 = local_2a48;
                        local_2274 = local_310c;
                        local_1928 = local_3104 + -1;
                        local_192c = local_310c + -1;
                        local_1920 = local_2a58;
                        local_1924 = local_3108;
                        local_1940 = local_3104 + -1;
                        local_1938 = local_2a58;
                        local_193c = local_3108;
                        local_1944 = local_310c;
                        local_2284 = local_3108 + -1;
                        local_2288 = local_3104 + 1;
                        local_2280 = local_2a48;
                        local_228c = local_310c;
                        local_1954 = local_3108 + -1;
                        local_195c = local_310c + -1;
                        local_1950 = local_2a58;
                        local_1958 = local_3104;
                        local_196c = local_3108 + -1;
                        local_1968 = local_2a58;
                        local_1970 = local_3104;
                        local_1974 = local_310c;
                        local_229c = local_3108 + 1;
                        local_22a0 = local_3104 + 1;
                        local_2298 = local_2a48;
                        local_22a4 = local_310c;
                        local_198c = local_310c + -1;
                        local_1980 = local_2a58;
                        local_1984 = local_3108;
                        local_1988 = local_3104;
                        local_1998 = local_2a58;
                        local_199c = local_3108;
                        local_19a0 = local_3104;
                        local_19a4 = local_310c;
                        local_22b4 = local_3108 + -1;
                        local_22b0 = local_2a48;
                        local_22b8 = local_3104;
                        local_22bc = local_310c;
                        local_19b4 = local_3108 + -1;
                        local_19b8 = local_3104 + -1;
                        local_19bc = local_310c + -1;
                        local_19b0 = local_2a58;
                        local_19cc = local_3108 + -1;
                        local_19d4 = local_310c + -1;
                        local_19c8 = local_2a58;
                        local_19d0 = local_3104;
                        local_19e4 = local_3108 + -1;
                        local_19e8 = local_3104 + -1;
                        local_19e0 = local_2a58;
                        local_19ec = local_310c;
                        local_19fc = local_3108 + -1;
                        local_19f8 = local_2a58;
                        local_1a00 = local_3104;
                        local_1a04 = local_310c;
                        local_22cc = local_3108 + 1;
                        local_22c8 = local_2a48;
                        local_22d0 = local_3104;
                        local_22d4 = local_310c;
                        local_1a18 = local_3104 + -1;
                        local_1a1c = local_310c + -1;
                        local_1a10 = local_2a58;
                        local_1a14 = local_3108;
                        local_1a34 = local_310c + -1;
                        local_1a28 = local_2a58;
                        local_1a2c = local_3108;
                        local_1a30 = local_3104;
                        local_1a48 = local_3104 + -1;
                        local_1a40 = local_2a58;
                        local_1a44 = local_3108;
                        local_1a4c = local_310c;
                        local_1a58 = local_2a58;
                        local_1a5c = local_3108;
                        local_1a60 = local_3104;
                        local_1a64 = local_310c;
                        local_22e8 = local_3104 + -1;
                        local_22e0 = local_2a48;
                        local_22e4 = local_3108;
                        local_22ec = local_310c;
                        local_1a74 = local_3108 + -1;
                        local_1a78 = local_3104 + -1;
                        local_1a7c = local_310c + -1;
                        local_1a70 = local_2a58;
                        local_1a90 = local_3104 + -1;
                        local_1a94 = local_310c + -1;
                        local_1a88 = local_2a58;
                        local_1a8c = local_3108;
                        local_1aa4 = local_3108 + -1;
                        local_1aa8 = local_3104 + -1;
                        local_1aa0 = local_2a58;
                        local_1aac = local_310c;
                        local_1ac0 = local_3104 + -1;
                        local_1ab8 = local_2a58;
                        local_1abc = local_3108;
                        local_1ac4 = local_310c;
                        local_2300 = local_3104 + 1;
                        local_22f8 = local_2a48;
                        local_22fc = local_3108;
                        local_2304 = local_310c;
                        local_1ad4 = local_3108 + -1;
                        local_1adc = local_310c + -1;
                        local_1ad0 = local_2a58;
                        local_1ad8 = local_3104;
                        local_1af4 = local_310c + -1;
                        local_1ae8 = local_2a58;
                        local_1aec = local_3108;
                        local_1af0 = local_3104;
                        local_1b04 = local_3108 + -1;
                        local_1b00 = local_2a58;
                        local_1b08 = local_3104;
                        local_1b0c = local_310c;
                        local_1b18 = local_2a58;
                        local_1b1c = local_3108;
                        local_1b20 = local_3104;
                        local_1b24 = local_310c;
                        local_3120 = local_2ab0 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_3108 - (int)local_2a48[4]) +
                                        (long)(local_22e8 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_1a74 - (int)local_2a58[4]) +
                                           (long)(local_1a78 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_1a7c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3108 - (int)local_2a58[4]) +
                                                 (long)(local_1a90 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_1a94 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_1aa4 - (int)local_2a58[4]) +
                                           (long)(local_1aa8 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3108 - (int)local_2a58[4]) +
                                                 (long)(local_1ac0 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_310c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3108 - (int)local_2a48[4]) +
                                       (long)(local_2300 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_1ad4 - (int)local_2a58[4]) +
                                          (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1adc - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1af4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_1b04 - (int)local_2a58[4]) +
                                          (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2aa8 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_22b4 - (int)local_2a48[4]) +
                                        (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_19b4 - (int)local_2a58[4]) +
                                           (long)(local_19b8 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_19bc - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_19cc - (int)local_2a58[4]) +
                                                 (long)(local_3104 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_19d4 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_19e4 - (int)local_2a58[4]) +
                                           (long)(local_19e8 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_19fc - (int)local_2a58[4]) +
                                                 (long)(local_3104 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_310c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_22cc - (int)local_2a48[4]) +
                                       (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_1a18 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1a1c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1a34 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_1a48 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2aa0 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_229c - (int)local_2a48[4]) +
                                        (long)(local_22a0 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_3108 - (int)local_2a58[4]) +
                                           (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_198c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3108 - (int)local_2a58[4]) +
                                                 (long)(local_3104 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_310c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_2284 - (int)local_2a48[4]) +
                                       (long)(local_2288 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_1954 - (int)local_2a58[4]) +
                                          (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_195c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_196c - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_2254 - (int)local_2a48[4]) +
                                       (long)(local_2258 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_18f4 - (int)local_2a58[4]) +
                                          (long)(local_18f8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_18fc - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_190c - (int)local_2a58[4]) +
                                                (long)(local_1910 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_226c - (int)local_2a48[4]) +
                                       (long)(local_2270 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_310c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_1928 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_192c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_1940 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2a98 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_223c - (int)local_2a48[4]) +
                                        (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_2244 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_3108 - (int)local_2a58[4]) +
                                           (long)(local_18c8 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3108 - (int)local_2a58[4]) +
                                                 (long)(local_3104 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_310c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_2224 - (int)local_2a48[4]) +
                                       (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_222c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_1894 - (int)local_2a58[4]) +
                                          (long)(local_1898 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_18ac - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_21f4 - (int)local_2a48[4]) +
                                       (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_21fc - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_1834 - (int)local_2a58[4]) +
                                          (long)(local_1838 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_183c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_184c - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1854 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_220c - (int)local_2a48[4]) +
                                       (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_2214 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_1868 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_186c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1884 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2a88 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_217c - (int)local_2a48[4]) +
                                        (long)(local_2180 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_2184 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * *(double *)
                                         (*local_2a58 +
                                         ((long)(local_3108 - (int)local_2a58[4]) +
                                          (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a48 +
                                               ((long)(local_2164 - (int)local_2a48[4]) +
                                                (long)(local_2168 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_216c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1744 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_214c - (int)local_2a48[4]) +
                                                (long)(local_2150 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_2154 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_1730 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_2134 - (int)local_2a48[4]) +
                                                (long)(local_2138 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_213c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1714 - (int)local_2a58[4]) +
                                                (long)(local_1718 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_211c - (int)local_2a48[4]) +
                                                (long)(local_2120 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_2124 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1704 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_2104 - (int)local_2a48[4]) +
                                                (long)(local_2108 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_210c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_16e4 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_16ec - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_20d4 - (int)local_2a48[4]) +
                                                (long)(local_20d8 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_20dc - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_16b4 - (int)local_2a58[4]) +
                                                (long)(local_16b8 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_16bc - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_20ec - (int)local_2a48[4]) +
                                                (long)(local_20f0 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_20f4 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_16d0 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_16d4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     local_2a90 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_3108 - (int)local_2a48[4]) +
                                        (long)(local_21e0 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_21e4 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_1804 - (int)local_2a58[4]) +
                                           (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3108 - (int)local_2a58[4]) +
                                                 (long)(local_3104 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_310c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3108 - (int)local_2a48[4]) +
                                       (long)(local_21c8 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_21cc - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_17d4 - (int)local_2a58[4]) +
                                          (long)(local_17d8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_17f0 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_310c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3108 - (int)local_2a48[4]) +
                                       (long)(local_2198 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_219c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_1774 - (int)local_2a58[4]) +
                                          (long)(local_1778 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_177c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_1790 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_1794 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3108 - (int)local_2a48[4]) +
                                       (long)(local_21b0 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_21b4 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_17a4 - (int)local_2a58[4]) +
                                          (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_17ac - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3108 - (int)local_2a58[4]) +
                                                (long)(local_3104 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_17c4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)));
                        local_1b34 = local_3108 + -1;
                        local_1b38 = local_3104 + -1;
                        local_1b3c = local_310c + -1;
                        local_1b30 = local_2a58;
                        local_1b50 = local_3104 + -1;
                        local_1b54 = local_310c + -1;
                        local_1b48 = local_2a58;
                        local_1b4c = local_3108;
                        local_1b64 = local_3108 + -1;
                        local_1b6c = local_310c + -1;
                        local_1b60 = local_2a58;
                        local_1b68 = local_3104;
                        local_1b84 = local_310c + -1;
                        local_1b78 = local_2a58;
                        local_1b7c = local_3108;
                        local_1b80 = local_3104;
                        local_56c = local_310c - local_2ac0;
                        local_568 = local_2c00;
                        local_568[local_56c] =
                             local_2ab8 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_1b34 - (int)local_2a58[4]) +
                                (long)(local_1b38 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_1b3c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_3108 - (int)local_2a58[4]) +
                                (long)(local_1b50 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_1b54 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_1b64 - (int)local_2a58[4]) +
                                (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_1b6c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_3108 - (int)local_2a58[4]) +
                               (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_1b84 - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_57c = local_310c - local_2ac0;
                        local_578 = local_2d00;
                        local_578[local_57c] = local_3118;
                        local_1b94 = local_3108 + -1;
                        local_1b98 = local_3104 + -1;
                        local_1b90 = local_2a58;
                        local_1b9c = local_310c;
                        local_1bb0 = local_3104 + -1;
                        local_1ba8 = local_2a58;
                        local_1bac = local_3108;
                        local_1bb4 = local_310c;
                        local_1bc4 = local_3108 + -1;
                        local_1bc0 = local_2a58;
                        local_1bc8 = local_3104;
                        local_1bcc = local_310c;
                        local_1bd8 = local_2a58;
                        local_1bdc = local_3108;
                        local_1be0 = local_3104;
                        local_1be4 = local_310c;
                        local_58c = local_310c - local_2ac0;
                        local_588 = local_2e00;
                        local_588[local_58c] =
                             local_2ab8 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_1b94 - (int)local_2a58[4]) +
                                (long)(local_1b98 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_3108 - (int)local_2a58[4]) +
                                (long)(local_1bb0 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_1bc4 - (int)local_2a58[4]) +
                                (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_3108 - (int)local_2a58[4]) +
                               (long)(local_3104 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_310c - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_59c = local_310c - local_2ac0;
                        local_598 = local_2f00;
                        local_598[local_59c] = 0.0;
                        local_1bf0 = local_2a50;
                        local_1bf4 = local_3108;
                        local_1bf8 = local_3104;
                        local_1bfc = local_310c;
                        local_5ac = local_310c - local_2ac0;
                        local_5a8 = local_3000;
                        local_5a8[local_5ac] =
                             *(double *)
                              (*local_2a50 +
                              ((long)(local_3108 - (int)local_2a50[4]) +
                               (long)(local_3104 - *(int *)((long)local_2a50 + 0x24)) *
                               local_2a50[1] +
                              (long)(local_310c - (int)local_2a50[5]) * local_2a50[2]) * 8) -
                             local_3120;
                      }
                      else {
                        local_5bc = local_310c - local_2ac0;
                        local_5b8 = local_2c00;
                        local_5b8[local_5bc] = 0.0;
                        local_5cc = local_310c - local_2ac0;
                        local_5c8 = local_2d00;
                        local_5c8[local_5cc] = 1.0;
                        local_5dc = local_310c - local_2ac0;
                        local_5d8 = local_2e00;
                        local_5d8[local_5dc] = 0.0;
                        local_5ec = local_310c - local_2ac0;
                        local_5e8 = local_2f00;
                        local_5e8[local_5ec] = 0.0;
                        local_5fc = local_310c - local_2ac0;
                        local_5f8 = local_3000;
                        local_5f8[local_5fc] = 0.0;
                      }
                    }
                    local_3b0 = local_2c00;
                    local_3b8 = local_2d00;
                    local_3c0 = local_2e00;
                    local_3c8 = local_3000;
                    local_3d0 = local_2f00;
                    local_3d8 = local_3100;
                    local_3dc = local_2b00;
                    local_2ac = 0;
                    local_3e8 = local_2d00[0];
                    local_2bc = 0;
                    local_2f00[0] = local_3000[0] / local_2d00[0];
                    local_2cc = 0;
                    local_2c8 = local_3d0;
                    local_2b8 = local_3c8;
                    local_2a8 = local_3b8;
                    for (local_3ec = 1; local_3ec <= local_3dc + -1; local_3ec = local_3ec + 1) {
                      local_2dc = local_3ec + -1;
                      local_2d8 = local_3c0;
                      local_2e8 = local_3d8;
                      local_2ec = local_3ec;
                      *(double *)(local_3d8 + (long)local_3ec * 8) =
                           local_3c0[local_2dc] / local_3e8;
                      local_2f8 = local_3b8;
                      local_2fc = local_3ec;
                      local_308 = local_3b0;
                      local_30c = local_3ec;
                      local_318 = local_3d8;
                      local_31c = local_3ec;
                      local_3e8 = -local_3b0[local_3ec] *
                                  *(double *)(local_3d8 + (long)local_3ec * 8) +
                                  local_3b8[local_3ec];
                      if ((local_3e8 == 0.0) && (!NAN(local_3e8))) {
                        local_3a8 = ">>>TRIDIAG FAILED";
                        Abort_host((char *)in_stack_ffffffffffffb670);
                      }
                      local_328 = local_3c8;
                      local_32c = local_3ec;
                      local_338 = local_3b0;
                      local_33c = local_3ec;
                      local_348 = local_3d0;
                      local_34c = local_3ec + -1;
                      local_358 = local_3d0;
                      local_35c = local_3ec;
                      local_3d0[local_3ec] =
                           (-local_3b0[local_3ec] * local_3d0[local_34c] + local_3c8[local_3ec]) /
                           local_3e8;
                    }
                    for (local_3f0 = local_3dc + -2; -1 < local_3f0; local_3f0 = local_3f0 + -1) {
                      local_368 = local_3d0;
                      local_36c = local_3f0;
                      local_378 = local_3d8;
                      local_37c = local_3f0 + 1;
                      local_388 = local_3d0;
                      local_38c = local_3f0 + 1;
                      local_398 = local_3d0;
                      local_39c = local_3f0;
                      local_3d0[local_3f0] =
                           -*(double *)(local_3d8 + (long)local_37c * 8) * local_3d0[local_38c] +
                           local_3d0[local_3f0];
                    }
                    for (local_3124 = local_2ac0; local_3124 <= local_2adc;
                        local_3124 = local_3124 + 1) {
                      local_55c = local_3124 - local_2ac0;
                      local_558 = local_2f00;
                      local_20b8 = local_2a48;
                      local_20bc = local_3108;
                      local_20c0 = local_3104;
                      local_20c4 = local_3124;
                      *(double *)
                       (*local_2a48 +
                       ((long)(local_3108 - (int)local_2a48[4]) +
                        (long)(local_3104 - *(int *)((long)local_2a48 + 0x24)) * local_2a48[1] +
                       (long)(local_3124 - (int)local_2a48[5]) * local_2a48[2]) * 8) =
                           local_558[local_55c];
                    }
                  }
                }
              }
              else if (local_2afc == 1) {
                for (local_3128 = local_2ac0; local_3128 <= local_2adc; local_3128 = local_3128 + 1)
                {
                  for (local_312c = (int)local_2ac8; local_312c <= (int)local_2ae4;
                      local_312c = local_312c + 1) {
                    for (local_3130 = local_2ac8._4_4_; local_3130 <= local_2ae4._4_4_;
                        local_3130 = local_3130 + 1) {
                      local_990 = local_2a60;
                      local_994 = local_312c;
                      local_998 = local_3130;
                      local_99c = local_3128;
                      if (*(int *)(*local_2a60 +
                                  ((long)(local_312c - *(int *)(local_2a60 + 4)) +
                                   (long)(local_3130 - *(int *)((long)local_2a60 + 0x24)) *
                                   *(long *)(local_2a60 + 1) +
                                  (long)(local_3128 - (int)local_2a60[5]) * local_2a60[2]) * 4) == 0
                         ) {
                        local_fdc = local_312c + -1;
                        local_fe0 = local_3130 + -1;
                        local_fe4 = local_3128 + -1;
                        local_fd8 = local_2a58;
                        local_ff8 = local_3130 + -1;
                        local_ffc = local_3128 + -1;
                        local_ff0 = local_2a58;
                        local_ff4 = local_312c;
                        local_100c = local_312c + -1;
                        local_1014 = local_3128 + -1;
                        local_1008 = local_2a58;
                        local_1010 = local_3130;
                        local_102c = local_3128 + -1;
                        local_1020 = local_2a58;
                        local_1024 = local_312c;
                        local_1028 = local_3130;
                        local_103c = local_312c + -1;
                        local_1040 = local_3130 + -1;
                        local_1038 = local_2a58;
                        local_1044 = local_3128;
                        local_1058 = local_3130 + -1;
                        local_1050 = local_2a58;
                        local_1054 = local_312c;
                        local_105c = local_3128;
                        local_106c = local_312c + -1;
                        local_1068 = local_2a58;
                        local_1070 = local_3130;
                        local_1074 = local_3128;
                        local_1080 = local_2a58;
                        local_1084 = local_312c;
                        local_1088 = local_3130;
                        local_108c = local_3128;
                        local_3138 = local_2a88 * -4.0 *
                                     (*(double *)
                                       (*local_2a58 +
                                       ((long)(local_fdc - (int)local_2a58[4]) +
                                        (long)(local_fe0 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_fe4 - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_ff8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_ffc - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_100c - (int)local_2a58[4]) +
                                               (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_1014 - (int)local_2a58[5]) *
                                              local_2a58[2]) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_312c - (int)local_2a58[4]) +
                                        (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_102c - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_103c - (int)local_2a58[4]) +
                                          (long)(local_1040 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_1058 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_106c - (int)local_2a58[4]) +
                                        (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                     + *(double *)
                                        (*local_2a58 +
                                        ((long)(local_312c - (int)local_2a58[4]) +
                                         (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                         local_2a58[1] +
                                        (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8
                                        ));
                        local_1e7c = local_312c + -1;
                        local_1e80 = local_3130 + -1;
                        local_1e84 = local_3128 + -1;
                        local_1e78 = local_2a48;
                        local_109c = local_312c + -1;
                        local_10a0 = local_3130 + -1;
                        local_10a4 = local_3128 + -1;
                        local_1098 = local_2a58;
                        local_1e94 = local_312c + 1;
                        local_1e98 = local_3130 + -1;
                        local_1e9c = local_3128 + -1;
                        local_1e90 = local_2a48;
                        local_10b8 = local_3130 + -1;
                        local_10bc = local_3128 + -1;
                        local_10b0 = local_2a58;
                        local_10b4 = local_312c;
                        local_1eac = local_312c + -1;
                        local_1eb0 = local_3130 + 1;
                        local_1eb4 = local_3128 + -1;
                        local_1ea8 = local_2a48;
                        local_10cc = local_312c + -1;
                        local_10d4 = local_3128 + -1;
                        local_10c8 = local_2a58;
                        local_10d0 = local_3130;
                        local_1ec4 = local_312c + 1;
                        local_1ec8 = local_3130 + 1;
                        local_1ecc = local_3128 + -1;
                        local_1ec0 = local_2a48;
                        local_10ec = local_3128 + -1;
                        local_10e0 = local_2a58;
                        local_10e4 = local_312c;
                        local_10e8 = local_3130;
                        local_1edc = local_312c + -1;
                        local_1ee0 = local_3130 + -1;
                        local_1ee4 = local_3128 + 1;
                        local_1ed8 = local_2a48;
                        local_10fc = local_312c + -1;
                        local_1100 = local_3130 + -1;
                        local_10f8 = local_2a58;
                        local_1104 = local_3128;
                        local_1ef4 = local_312c + 1;
                        local_1ef8 = local_3130 + -1;
                        local_1efc = local_3128 + 1;
                        local_1ef0 = local_2a48;
                        local_1118 = local_3130 + -1;
                        local_1110 = local_2a58;
                        local_1114 = local_312c;
                        local_111c = local_3128;
                        local_1f0c = local_312c + -1;
                        local_1f10 = local_3130 + 1;
                        local_1f14 = local_3128 + 1;
                        local_1f08 = local_2a48;
                        local_112c = local_312c + -1;
                        local_1128 = local_2a58;
                        local_1130 = local_3130;
                        local_1134 = local_3128;
                        local_1f24 = local_312c + 1;
                        local_1f28 = local_3130 + 1;
                        local_1f2c = local_3128 + 1;
                        local_1f20 = local_2a48;
                        local_1140 = local_2a58;
                        local_1144 = local_312c;
                        local_1148 = local_3130;
                        local_114c = local_3128;
                        local_1f40 = local_3130 + -1;
                        local_1f44 = local_3128 + -1;
                        local_1f38 = local_2a48;
                        local_1f3c = local_312c;
                        local_115c = local_312c + -1;
                        local_1160 = local_3130 + -1;
                        local_1164 = local_3128 + -1;
                        local_1158 = local_2a58;
                        local_1178 = local_3130 + -1;
                        local_117c = local_3128 + -1;
                        local_1170 = local_2a58;
                        local_1174 = local_312c;
                        local_1f58 = local_3130 + 1;
                        local_1f5c = local_3128 + -1;
                        local_1f50 = local_2a48;
                        local_1f54 = local_312c;
                        local_118c = local_312c + -1;
                        local_1194 = local_3128 + -1;
                        local_1188 = local_2a58;
                        local_1190 = local_3130;
                        local_11ac = local_3128 + -1;
                        local_11a0 = local_2a58;
                        local_11a4 = local_312c;
                        local_11a8 = local_3130;
                        local_1f70 = local_3130 + -1;
                        local_1f74 = local_3128 + 1;
                        local_1f68 = local_2a48;
                        local_1f6c = local_312c;
                        local_11bc = local_312c + -1;
                        local_11c0 = local_3130 + -1;
                        local_11b8 = local_2a58;
                        local_11c4 = local_3128;
                        local_11d8 = local_3130 + -1;
                        local_11d0 = local_2a58;
                        local_11d4 = local_312c;
                        local_11dc = local_3128;
                        local_1f88 = local_3130 + 1;
                        local_1f8c = local_3128 + 1;
                        local_1f80 = local_2a48;
                        local_1f84 = local_312c;
                        local_11ec = local_312c + -1;
                        local_11e8 = local_2a58;
                        local_11f0 = local_3130;
                        local_11f4 = local_3128;
                        local_1200 = local_2a58;
                        local_1204 = local_312c;
                        local_1208 = local_3130;
                        local_120c = local_3128;
                        local_1f9c = local_312c + -1;
                        local_1fa4 = local_3128 + -1;
                        local_1f98 = local_2a48;
                        local_1fa0 = local_3130;
                        local_121c = local_312c + -1;
                        local_1220 = local_3130 + -1;
                        local_1224 = local_3128 + -1;
                        local_1218 = local_2a58;
                        local_1234 = local_312c + -1;
                        local_123c = local_3128 + -1;
                        local_1230 = local_2a58;
                        local_1238 = local_3130;
                        local_1fb4 = local_312c + 1;
                        local_1fbc = local_3128 + -1;
                        local_1fb0 = local_2a48;
                        local_1fb8 = local_3130;
                        local_1250 = local_3130 + -1;
                        local_1254 = local_3128 + -1;
                        local_1248 = local_2a58;
                        local_124c = local_312c;
                        local_126c = local_3128 + -1;
                        local_1260 = local_2a58;
                        local_1264 = local_312c;
                        local_1268 = local_3130;
                        local_1fcc = local_312c + -1;
                        local_1fd4 = local_3128 + 1;
                        local_1fc8 = local_2a48;
                        local_1fd0 = local_3130;
                        local_127c = local_312c + -1;
                        local_1280 = local_3130 + -1;
                        local_1278 = local_2a58;
                        local_1284 = local_3128;
                        local_1294 = local_312c + -1;
                        local_1290 = local_2a58;
                        local_1298 = local_3130;
                        local_129c = local_3128;
                        local_1fe4 = local_312c + 1;
                        local_1fec = local_3128 + 1;
                        local_1fe0 = local_2a48;
                        local_1fe8 = local_3130;
                        local_12b0 = local_3130 + -1;
                        local_12a8 = local_2a58;
                        local_12ac = local_312c;
                        local_12b4 = local_3128;
                        local_12c0 = local_2a58;
                        local_12c4 = local_312c;
                        local_12c8 = local_3130;
                        local_12cc = local_3128;
                        local_1ffc = local_312c + -1;
                        local_2000 = local_3130 + -1;
                        local_1ff8 = local_2a48;
                        local_2004 = local_3128;
                        local_12dc = local_312c + -1;
                        local_12e0 = local_3130 + -1;
                        local_12e4 = local_3128 + -1;
                        local_12d8 = local_2a58;
                        local_12f4 = local_312c + -1;
                        local_12f8 = local_3130 + -1;
                        local_12f0 = local_2a58;
                        local_12fc = local_3128;
                        local_2014 = local_312c + 1;
                        local_2018 = local_3130 + -1;
                        local_2010 = local_2a48;
                        local_201c = local_3128;
                        local_1310 = local_3130 + -1;
                        local_1314 = local_3128 + -1;
                        local_1308 = local_2a58;
                        local_130c = local_312c;
                        local_1328 = local_3130 + -1;
                        local_1320 = local_2a58;
                        local_1324 = local_312c;
                        local_132c = local_3128;
                        local_202c = local_312c + -1;
                        local_2030 = local_3130 + 1;
                        local_2028 = local_2a48;
                        local_2034 = local_3128;
                        local_133c = local_312c + -1;
                        local_1344 = local_3128 + -1;
                        local_1338 = local_2a58;
                        local_1340 = local_3130;
                        local_1354 = local_312c + -1;
                        local_1350 = local_2a58;
                        local_1358 = local_3130;
                        local_135c = local_3128;
                        local_2044 = local_312c + 1;
                        local_2048 = local_3130 + 1;
                        local_2040 = local_2a48;
                        local_204c = local_3128;
                        local_1374 = local_3128 + -1;
                        local_1368 = local_2a58;
                        local_136c = local_312c;
                        local_1370 = local_3130;
                        local_1380 = local_2a58;
                        local_1384 = local_312c;
                        local_1388 = local_3130;
                        local_138c = local_3128;
                        local_205c = local_312c + -1;
                        local_2058 = local_2a48;
                        local_2060 = local_3130;
                        local_2064 = local_3128;
                        local_139c = local_312c + -1;
                        local_13a0 = local_3130 + -1;
                        local_13a4 = local_3128 + -1;
                        local_1398 = local_2a58;
                        local_13b4 = local_312c + -1;
                        local_13bc = local_3128 + -1;
                        local_13b0 = local_2a58;
                        local_13b8 = local_3130;
                        local_13cc = local_312c + -1;
                        local_13d0 = local_3130 + -1;
                        local_13c8 = local_2a58;
                        local_13d4 = local_3128;
                        local_13e4 = local_312c + -1;
                        local_13e0 = local_2a58;
                        local_13e8 = local_3130;
                        local_13ec = local_3128;
                        local_2074 = local_312c + 1;
                        local_2070 = local_2a48;
                        local_2078 = local_3130;
                        local_207c = local_3128;
                        local_1400 = local_3130 + -1;
                        local_1404 = local_3128 + -1;
                        local_13f8 = local_2a58;
                        local_13fc = local_312c;
                        local_141c = local_3128 + -1;
                        local_1410 = local_2a58;
                        local_1414 = local_312c;
                        local_1418 = local_3130;
                        local_1430 = local_3130 + -1;
                        local_1428 = local_2a58;
                        local_142c = local_312c;
                        local_1434 = local_3128;
                        local_1440 = local_2a58;
                        local_1444 = local_312c;
                        local_1448 = local_3130;
                        local_144c = local_3128;
                        local_2094 = local_3128 + -1;
                        local_2088 = local_2a48;
                        local_208c = local_312c;
                        local_2090 = local_3130;
                        local_145c = local_312c + -1;
                        local_1460 = local_3130 + -1;
                        local_1464 = local_3128 + -1;
                        local_1458 = local_2a58;
                        local_1478 = local_3130 + -1;
                        local_147c = local_3128 + -1;
                        local_1470 = local_2a58;
                        local_1474 = local_312c;
                        local_148c = local_312c + -1;
                        local_1494 = local_3128 + -1;
                        local_1488 = local_2a58;
                        local_1490 = local_3130;
                        local_14ac = local_3128 + -1;
                        local_14a0 = local_2a58;
                        local_14a4 = local_312c;
                        local_14a8 = local_3130;
                        local_20ac = local_3128 + 1;
                        local_20a0 = local_2a48;
                        local_20a4 = local_312c;
                        local_20a8 = local_3130;
                        local_14bc = local_312c + -1;
                        local_14c0 = local_3130 + -1;
                        local_14b8 = local_2a58;
                        local_14c4 = local_3128;
                        local_14d8 = local_3130 + -1;
                        local_14d0 = local_2a58;
                        local_14d4 = local_312c;
                        local_14dc = local_3128;
                        local_14ec = local_312c + -1;
                        local_14e8 = local_2a58;
                        local_14f0 = local_3130;
                        local_14f4 = local_3128;
                        local_1500 = local_2a58;
                        local_1504 = local_312c;
                        local_1508 = local_3130;
                        local_150c = local_3128;
                        local_3140 = local_2ab8 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_312c - (int)local_2a48[4]) +
                                        (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_2094 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_145c - (int)local_2a58[4]) +
                                           (long)(local_1460 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_1464 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_312c - (int)local_2a58[4]) +
                                                 (long)(local_1478 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_147c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_148c - (int)local_2a58[4]) +
                                           (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_1494 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_312c - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_14ac - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_312c - (int)local_2a48[4]) +
                                       (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_20ac - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_14bc - (int)local_2a58[4]) +
                                          (long)(local_14c0 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_14d8 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_14ec - (int)local_2a58[4]) +
                                          (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2aa8 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_205c - (int)local_2a48[4]) +
                                        (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_139c - (int)local_2a58[4]) +
                                           (long)(local_13a0 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_13a4 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_13b4 - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_13bc - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_13cc - (int)local_2a58[4]) +
                                           (long)(local_13d0 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_13e4 - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_3128 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_2074 - (int)local_2a48[4]) +
                                       (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_1400 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1404 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_141c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_1430 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2aa0 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_2044 - (int)local_2a48[4]) +
                                        (long)(local_2048 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_312c - (int)local_2a58[4]) +
                                           (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_1374 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_312c - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_3128 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_202c - (int)local_2a48[4]) +
                                       (long)(local_2030 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_133c - (int)local_2a58[4]) +
                                          (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1344 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1354 - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1ffc - (int)local_2a48[4]) +
                                       (long)(local_2000 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_12dc - (int)local_2a58[4]) +
                                          (long)(local_12e0 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_12e4 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_12f4 - (int)local_2a58[4]) +
                                                (long)(local_12f8 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_2014 - (int)local_2a48[4]) +
                                       (long)(local_2018 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_1310 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1314 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_1328 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2a98 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_1fe4 - (int)local_2a48[4]) +
                                        (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1fec - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_312c - (int)local_2a58[4]) +
                                           (long)(local_12b0 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_312c - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_3128 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1fcc - (int)local_2a48[4]) +
                                       (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1fd4 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_127c - (int)local_2a58[4]) +
                                          (long)(local_1280 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1294 - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1f9c - (int)local_2a48[4]) +
                                       (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1fa4 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_121c - (int)local_2a58[4]) +
                                          (long)(local_1220 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1224 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_1234 - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_123c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1fb4 - (int)local_2a48[4]) +
                                       (long)(local_3130 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1fbc - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_1250 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1254 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_126c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2a88 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_1f24 - (int)local_2a48[4]) +
                                        (long)(local_1f28 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1f2c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * *(double *)
                                         (*local_2a58 +
                                         ((long)(local_312c - (int)local_2a58[4]) +
                                          (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1f0c - (int)local_2a48[4]) +
                                                (long)(local_1f10 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1f14 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_112c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1ef4 - (int)local_2a48[4]) +
                                                (long)(local_1ef8 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1efc - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_1118 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1edc - (int)local_2a48[4]) +
                                                (long)(local_1ee0 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1ee4 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_10fc - (int)local_2a58[4]) +
                                                (long)(local_1100 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1ec4 - (int)local_2a48[4]) +
                                                (long)(local_1ec8 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1ecc - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_10ec - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1eac - (int)local_2a48[4]) +
                                                (long)(local_1eb0 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1eb4 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_10cc - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_10d4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1e7c - (int)local_2a48[4]) +
                                                (long)(local_1e80 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1e84 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_109c - (int)local_2a58[4]) +
                                                (long)(local_10a0 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_10a4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1e94 - (int)local_2a48[4]) +
                                                (long)(local_1e98 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1e9c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_10b8 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_10bc - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     local_2a90 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_312c - (int)local_2a48[4]) +
                                        (long)(local_1f88 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1f8c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_11ec - (int)local_2a58[4]) +
                                           (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_312c - (int)local_2a58[4]) +
                                                 (long)(local_3130 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_3128 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_312c - (int)local_2a48[4]) +
                                       (long)(local_1f70 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1f74 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_11bc - (int)local_2a58[4]) +
                                          (long)(local_11c0 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_11d8 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_3128 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_312c - (int)local_2a48[4]) +
                                       (long)(local_1f40 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1f44 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_115c - (int)local_2a58[4]) +
                                          (long)(local_1160 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1164 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_1178 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_117c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_312c - (int)local_2a48[4]) +
                                       (long)(local_1f58 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1f5c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_118c - (int)local_2a58[4]) +
                                          (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_1194 - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_312c - (int)local_2a58[4]) +
                                                (long)(local_3130 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_11ac - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)));
                        local_151c = local_312c + -1;
                        local_1520 = local_3130 + -1;
                        local_1524 = local_3128 + -1;
                        local_1518 = local_2a58;
                        local_1538 = local_3130 + -1;
                        local_153c = local_3128 + -1;
                        local_1530 = local_2a58;
                        local_1534 = local_312c;
                        local_154c = local_312c + -1;
                        local_1550 = local_3130 + -1;
                        local_1548 = local_2a58;
                        local_1554 = local_3128;
                        local_1568 = local_3130 + -1;
                        local_1560 = local_2a58;
                        local_1564 = local_312c;
                        local_156c = local_3128;
                        local_4bc = local_3130 - local_2ac8._4_4_;
                        local_4b8 = local_2c00;
                        local_4b8[local_4bc] =
                             local_2ab0 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_151c - (int)local_2a58[4]) +
                                (long)(local_1520 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_1524 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_312c - (int)local_2a58[4]) +
                                (long)(local_1538 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_153c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_154c - (int)local_2a58[4]) +
                                (long)(local_1550 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_312c - (int)local_2a58[4]) +
                               (long)(local_1568 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_4cc = local_3130 - local_2ac8._4_4_;
                        local_4c8 = local_2d00;
                        local_4c8[local_4cc] = local_3138;
                        local_157c = local_312c + -1;
                        local_1584 = local_3128 + -1;
                        local_1578 = local_2a58;
                        local_1580 = local_3130;
                        local_159c = local_3128 + -1;
                        local_1590 = local_2a58;
                        local_1594 = local_312c;
                        local_1598 = local_3130;
                        local_15ac = local_312c + -1;
                        local_15a8 = local_2a58;
                        local_15b0 = local_3130;
                        local_15b4 = local_3128;
                        local_15c0 = local_2a58;
                        local_15c4 = local_312c;
                        local_15c8 = local_3130;
                        local_15cc = local_3128;
                        local_4dc = local_3130 - local_2ac8._4_4_;
                        local_4d8 = local_2e00;
                        local_4d8[local_4dc] =
                             local_2ab0 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_157c - (int)local_2a58[4]) +
                                (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_1584 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_312c - (int)local_2a58[4]) +
                                (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_159c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_15ac - (int)local_2a58[4]) +
                                (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_312c - (int)local_2a58[4]) +
                               (long)(local_3130 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_3128 - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_4ec = local_3130 - local_2ac8._4_4_;
                        local_4e8 = local_2f00;
                        local_4e8[local_4ec] = 0.0;
                        local_15d8 = local_2a50;
                        local_15dc = local_312c;
                        local_15e0 = local_3130;
                        local_15e4 = local_3128;
                        local_4fc = local_3130 - local_2ac8._4_4_;
                        local_4f8 = local_3000;
                        local_4f8[local_4fc] =
                             *(double *)
                              (*local_2a50 +
                              ((long)(local_312c - (int)local_2a50[4]) +
                               (long)(local_3130 - *(int *)((long)local_2a50 + 0x24)) *
                               local_2a50[1] +
                              (long)(local_3128 - (int)local_2a50[5]) * local_2a50[2]) * 8) -
                             local_3140;
                      }
                      else {
                        local_50c = local_3130 - local_2ac8._4_4_;
                        local_508 = local_2c00;
                        local_508[local_50c] = 0.0;
                        local_51c = local_3130 - local_2ac8._4_4_;
                        local_518 = local_2d00;
                        local_518[local_51c] = 1.0;
                        local_52c = local_3130 - local_2ac8._4_4_;
                        local_528 = local_2e00;
                        local_528[local_52c] = 0.0;
                        local_53c = local_3130 - local_2ac8._4_4_;
                        local_538 = local_2f00;
                        local_538[local_53c] = 0.0;
                        local_54c = local_3130 - local_2ac8._4_4_;
                        local_548 = local_3000;
                        local_548[local_54c] = 0.0;
                      }
                    }
                    local_260 = local_2c00;
                    local_268 = local_2d00;
                    local_270 = local_2e00;
                    local_278 = local_3000;
                    local_280 = local_2f00;
                    local_288 = local_3100;
                    local_28c = local_2b00;
                    local_15c = 0;
                    local_298 = local_2d00[0];
                    local_16c = 0;
                    local_2f00[0] = local_3000[0] / local_2d00[0];
                    local_17c = 0;
                    local_178 = local_280;
                    local_168 = local_278;
                    local_158 = local_268;
                    for (local_29c = 1; local_29c <= local_28c + -1; local_29c = local_29c + 1) {
                      local_18c = local_29c + -1;
                      local_188 = local_270;
                      local_198 = local_288;
                      local_19c = local_29c;
                      *(double *)(local_288 + (long)local_29c * 8) =
                           local_270[local_18c] / local_298;
                      local_1a8 = local_268;
                      local_1ac = local_29c;
                      local_1b8 = local_260;
                      local_1bc = local_29c;
                      local_1c8 = local_288;
                      local_1cc = local_29c;
                      local_298 = -local_260[local_29c] *
                                  *(double *)(local_288 + (long)local_29c * 8) +
                                  local_268[local_29c];
                      if ((local_298 == 0.0) && (!NAN(local_298))) {
                        local_258 = ">>>TRIDIAG FAILED";
                        Abort_host((char *)in_stack_ffffffffffffb670);
                      }
                      local_1d8 = local_278;
                      local_1dc = local_29c;
                      local_1e8 = local_260;
                      local_1ec = local_29c;
                      local_1f8 = local_280;
                      local_1fc = local_29c + -1;
                      local_208 = local_280;
                      local_20c = local_29c;
                      local_280[local_29c] =
                           (-local_260[local_29c] * local_280[local_1fc] + local_278[local_29c]) /
                           local_298;
                    }
                    for (local_2a0 = local_28c + -2; -1 < local_2a0; local_2a0 = local_2a0 + -1) {
                      local_218 = local_280;
                      local_21c = local_2a0;
                      local_228 = local_288;
                      local_22c = local_2a0 + 1;
                      local_238 = local_280;
                      local_23c = local_2a0 + 1;
                      local_248 = local_280;
                      local_24c = local_2a0;
                      local_280[local_2a0] =
                           -*(double *)(local_288 + (long)local_22c * 8) * local_280[local_23c] +
                           local_280[local_2a0];
                    }
                    for (local_3144 = local_2ac8._4_4_; local_3144 <= local_2ae4._4_4_;
                        local_3144 = local_3144 + 1) {
                      local_4ac = local_3144 - local_2ac8._4_4_;
                      local_4a8 = local_2f00;
                      local_1e60 = local_2a48;
                      local_1e64 = local_312c;
                      local_1e68 = local_3144;
                      local_1e6c = local_3128;
                      *(double *)
                       (*local_2a48 +
                       ((long)(local_312c - (int)local_2a48[4]) +
                        (long)(local_3144 - *(int *)((long)local_2a48 + 0x24)) * local_2a48[1] +
                       (long)(local_3128 - (int)local_2a48[5]) * local_2a48[2]) * 8) =
                           local_4a8[local_4ac];
                    }
                  }
                }
              }
              else if (local_2afc == 0) {
                for (local_3148 = local_2ac8._4_4_; local_3148 <= local_2ae4._4_4_;
                    local_3148 = local_3148 + 1) {
                  for (local_314c = local_2ac0; local_314c <= local_2adc;
                      local_314c = local_314c + 1) {
                    for (local_3150 = (int)local_2ac8; local_3150 <= (int)local_2ae4;
                        local_3150 = local_3150 + 1) {
                      local_978 = local_2a60;
                      local_97c = local_3150;
                      local_980 = local_3148;
                      local_984 = local_314c;
                      if (*(int *)(*local_2a60 +
                                  ((long)(local_3150 - *(int *)(local_2a60 + 4)) +
                                   (long)(local_3148 - *(int *)((long)local_2a60 + 0x24)) *
                                   *(long *)(local_2a60 + 1) +
                                  (long)(local_314c - (int)local_2a60[5]) * local_2a60[2]) * 4) == 0
                         ) {
                        local_9c4 = local_3150 + -1;
                        local_9c8 = local_3148 + -1;
                        local_9cc = local_314c + -1;
                        local_9c0 = local_2a58;
                        local_9e0 = local_3148 + -1;
                        local_9e4 = local_314c + -1;
                        local_9d8 = local_2a58;
                        local_9dc = local_3150;
                        local_9f4 = local_3150 + -1;
                        local_9fc = local_314c + -1;
                        local_9f0 = local_2a58;
                        local_9f8 = local_3148;
                        local_a14 = local_314c + -1;
                        local_a08 = local_2a58;
                        local_a0c = local_3150;
                        local_a10 = local_3148;
                        local_a24 = local_3150 + -1;
                        local_a28 = local_3148 + -1;
                        local_a20 = local_2a58;
                        local_a2c = local_314c;
                        local_a40 = local_3148 + -1;
                        local_a38 = local_2a58;
                        local_a3c = local_3150;
                        local_a44 = local_314c;
                        local_a54 = local_3150 + -1;
                        local_a50 = local_2a58;
                        local_a58 = local_3148;
                        local_a5c = local_314c;
                        local_a68 = local_2a58;
                        local_a6c = local_3150;
                        local_a70 = local_3148;
                        local_a74 = local_314c;
                        local_3158 = local_2a88 * -4.0 *
                                     (*(double *)
                                       (*local_2a58 +
                                       ((long)(local_9c4 - (int)local_2a58[4]) +
                                        (long)(local_9c8 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_9cc - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_3150 - (int)local_2a58[4]) +
                                          (long)(local_9e0 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_9e4 - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_9f4 - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_9fc - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_3150 - (int)local_2a58[4]) +
                                        (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_a14 - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                      + *(double *)
                                         (*local_2a58 +
                                         ((long)(local_a24 - (int)local_2a58[4]) +
                                          (long)(local_a28 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_a40 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                      *(double *)
                                       (*local_2a58 +
                                       ((long)(local_a54 - (int)local_2a58[4]) +
                                        (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                        local_2a58[1] +
                                       (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8)
                                     + *(double *)
                                        (*local_2a58 +
                                        ((long)(local_3150 - (int)local_2a58[4]) +
                                         (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                         local_2a58[1] +
                                        (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                        ));
                        local_1c24 = local_3150 + -1;
                        local_1c28 = local_3148 + -1;
                        local_1c2c = local_314c + -1;
                        local_1c20 = local_2a48;
                        local_a84 = local_3150 + -1;
                        local_a88 = local_3148 + -1;
                        local_a8c = local_314c + -1;
                        local_a80 = local_2a58;
                        local_1c3c = local_3150 + 1;
                        local_1c40 = local_3148 + -1;
                        local_1c44 = local_314c + -1;
                        local_1c38 = local_2a48;
                        local_aa0 = local_3148 + -1;
                        local_aa4 = local_314c + -1;
                        local_a98 = local_2a58;
                        local_a9c = local_3150;
                        local_1c54 = local_3150 + -1;
                        local_1c58 = local_3148 + 1;
                        local_1c5c = local_314c + -1;
                        local_1c50 = local_2a48;
                        local_ab4 = local_3150 + -1;
                        local_abc = local_314c + -1;
                        local_ab0 = local_2a58;
                        local_ab8 = local_3148;
                        local_1c6c = local_3150 + 1;
                        local_1c70 = local_3148 + 1;
                        local_1c74 = local_314c + -1;
                        local_1c68 = local_2a48;
                        local_ad4 = local_314c + -1;
                        local_ac8 = local_2a58;
                        local_acc = local_3150;
                        local_ad0 = local_3148;
                        local_1c84 = local_3150 + -1;
                        local_1c88 = local_3148 + -1;
                        local_1c8c = local_314c + 1;
                        local_1c80 = local_2a48;
                        local_ae4 = local_3150 + -1;
                        local_ae8 = local_3148 + -1;
                        local_ae0 = local_2a58;
                        local_aec = local_314c;
                        local_1c9c = local_3150 + 1;
                        local_1ca0 = local_3148 + -1;
                        local_1ca4 = local_314c + 1;
                        local_1c98 = local_2a48;
                        local_b00 = local_3148 + -1;
                        local_af8 = local_2a58;
                        local_afc = local_3150;
                        local_b04 = local_314c;
                        local_1cb4 = local_3150 + -1;
                        local_1cb8 = local_3148 + 1;
                        local_1cbc = local_314c + 1;
                        local_1cb0 = local_2a48;
                        local_b14 = local_3150 + -1;
                        local_b10 = local_2a58;
                        local_b18 = local_3148;
                        local_b1c = local_314c;
                        local_1ccc = local_3150 + 1;
                        local_1cd0 = local_3148 + 1;
                        local_1cd4 = local_314c + 1;
                        local_1cc8 = local_2a48;
                        local_b28 = local_2a58;
                        local_b2c = local_3150;
                        local_b30 = local_3148;
                        local_b34 = local_314c;
                        local_1ce8 = local_3148 + -1;
                        local_1cec = local_314c + -1;
                        local_1ce0 = local_2a48;
                        local_1ce4 = local_3150;
                        local_b44 = local_3150 + -1;
                        local_b48 = local_3148 + -1;
                        local_b4c = local_314c + -1;
                        local_b40 = local_2a58;
                        local_b60 = local_3148 + -1;
                        local_b64 = local_314c + -1;
                        local_b58 = local_2a58;
                        local_b5c = local_3150;
                        local_1d00 = local_3148 + 1;
                        local_1d04 = local_314c + -1;
                        local_1cf8 = local_2a48;
                        local_1cfc = local_3150;
                        local_b74 = local_3150 + -1;
                        local_b7c = local_314c + -1;
                        local_b70 = local_2a58;
                        local_b78 = local_3148;
                        local_b94 = local_314c + -1;
                        local_b88 = local_2a58;
                        local_b8c = local_3150;
                        local_b90 = local_3148;
                        local_1d18 = local_3148 + -1;
                        local_1d1c = local_314c + 1;
                        local_1d10 = local_2a48;
                        local_1d14 = local_3150;
                        local_ba4 = local_3150 + -1;
                        local_ba8 = local_3148 + -1;
                        local_ba0 = local_2a58;
                        local_bac = local_314c;
                        local_bc0 = local_3148 + -1;
                        local_bb8 = local_2a58;
                        local_bbc = local_3150;
                        local_bc4 = local_314c;
                        local_1d30 = local_3148 + 1;
                        local_1d34 = local_314c + 1;
                        local_1d28 = local_2a48;
                        local_1d2c = local_3150;
                        local_bd4 = local_3150 + -1;
                        local_bd0 = local_2a58;
                        local_bd8 = local_3148;
                        local_bdc = local_314c;
                        local_be8 = local_2a58;
                        local_bec = local_3150;
                        local_bf0 = local_3148;
                        local_bf4 = local_314c;
                        local_1d44 = local_3150 + -1;
                        local_1d4c = local_314c + -1;
                        local_1d40 = local_2a48;
                        local_1d48 = local_3148;
                        local_c04 = local_3150 + -1;
                        local_c08 = local_3148 + -1;
                        local_c0c = local_314c + -1;
                        local_c00 = local_2a58;
                        local_c1c = local_3150 + -1;
                        local_c24 = local_314c + -1;
                        local_c18 = local_2a58;
                        local_c20 = local_3148;
                        local_1d5c = local_3150 + 1;
                        local_1d64 = local_314c + -1;
                        local_1d58 = local_2a48;
                        local_1d60 = local_3148;
                        local_c38 = local_3148 + -1;
                        local_c3c = local_314c + -1;
                        local_c30 = local_2a58;
                        local_c34 = local_3150;
                        local_c54 = local_314c + -1;
                        local_c48 = local_2a58;
                        local_c4c = local_3150;
                        local_c50 = local_3148;
                        local_1d74 = local_3150 + -1;
                        local_1d7c = local_314c + 1;
                        local_1d70 = local_2a48;
                        local_1d78 = local_3148;
                        local_c64 = local_3150 + -1;
                        local_c68 = local_3148 + -1;
                        local_c60 = local_2a58;
                        local_c6c = local_314c;
                        local_c7c = local_3150 + -1;
                        local_c78 = local_2a58;
                        local_c80 = local_3148;
                        local_c84 = local_314c;
                        local_1d8c = local_3150 + 1;
                        local_1d94 = local_314c + 1;
                        local_1d88 = local_2a48;
                        local_1d90 = local_3148;
                        local_c98 = local_3148 + -1;
                        local_c90 = local_2a58;
                        local_c94 = local_3150;
                        local_c9c = local_314c;
                        local_ca8 = local_2a58;
                        local_cac = local_3150;
                        local_cb0 = local_3148;
                        local_cb4 = local_314c;
                        local_1da4 = local_3150 + -1;
                        local_1da8 = local_3148 + -1;
                        local_1da0 = local_2a48;
                        local_1dac = local_314c;
                        local_cc4 = local_3150 + -1;
                        local_cc8 = local_3148 + -1;
                        local_ccc = local_314c + -1;
                        local_cc0 = local_2a58;
                        local_cdc = local_3150 + -1;
                        local_ce0 = local_3148 + -1;
                        local_cd8 = local_2a58;
                        local_ce4 = local_314c;
                        local_1dbc = local_3150 + 1;
                        local_1dc0 = local_3148 + -1;
                        local_1db8 = local_2a48;
                        local_1dc4 = local_314c;
                        local_cf8 = local_3148 + -1;
                        local_cfc = local_314c + -1;
                        local_cf0 = local_2a58;
                        local_cf4 = local_3150;
                        local_d10 = local_3148 + -1;
                        local_d08 = local_2a58;
                        local_d0c = local_3150;
                        local_d14 = local_314c;
                        local_1dd4 = local_3150 + -1;
                        local_1dd8 = local_3148 + 1;
                        local_1dd0 = local_2a48;
                        local_1ddc = local_314c;
                        local_d24 = local_3150 + -1;
                        local_d2c = local_314c + -1;
                        local_d20 = local_2a58;
                        local_d28 = local_3148;
                        local_d3c = local_3150 + -1;
                        local_d38 = local_2a58;
                        local_d40 = local_3148;
                        local_d44 = local_314c;
                        local_1dec = local_3150 + 1;
                        local_1df0 = local_3148 + 1;
                        local_1de8 = local_2a48;
                        local_1df4 = local_314c;
                        local_d5c = local_314c + -1;
                        local_d50 = local_2a58;
                        local_d54 = local_3150;
                        local_d58 = local_3148;
                        local_d68 = local_2a58;
                        local_d6c = local_3150;
                        local_d70 = local_3148;
                        local_d74 = local_314c;
                        local_1e08 = local_3148 + -1;
                        local_1e00 = local_2a48;
                        local_1e04 = local_3150;
                        local_1e0c = local_314c;
                        local_d84 = local_3150 + -1;
                        local_d88 = local_3148 + -1;
                        local_d8c = local_314c + -1;
                        local_d80 = local_2a58;
                        local_da0 = local_3148 + -1;
                        local_da4 = local_314c + -1;
                        local_d98 = local_2a58;
                        local_d9c = local_3150;
                        local_db4 = local_3150 + -1;
                        local_db8 = local_3148 + -1;
                        local_db0 = local_2a58;
                        local_dbc = local_314c;
                        local_dd0 = local_3148 + -1;
                        local_dc8 = local_2a58;
                        local_dcc = local_3150;
                        local_dd4 = local_314c;
                        local_1e20 = local_3148 + 1;
                        local_1e18 = local_2a48;
                        local_1e1c = local_3150;
                        local_1e24 = local_314c;
                        local_de4 = local_3150 + -1;
                        local_dec = local_314c + -1;
                        local_de0 = local_2a58;
                        local_de8 = local_3148;
                        local_e04 = local_314c + -1;
                        local_df8 = local_2a58;
                        local_dfc = local_3150;
                        local_e00 = local_3148;
                        local_e14 = local_3150 + -1;
                        local_e10 = local_2a58;
                        local_e18 = local_3148;
                        local_e1c = local_314c;
                        local_e28 = local_2a58;
                        local_e2c = local_3150;
                        local_e30 = local_3148;
                        local_e34 = local_314c;
                        local_1e3c = local_314c + -1;
                        local_1e30 = local_2a48;
                        local_1e34 = local_3150;
                        local_1e38 = local_3148;
                        local_e44 = local_3150 + -1;
                        local_e48 = local_3148 + -1;
                        local_e4c = local_314c + -1;
                        local_e40 = local_2a58;
                        local_e60 = local_3148 + -1;
                        local_e64 = local_314c + -1;
                        local_e58 = local_2a58;
                        local_e5c = local_3150;
                        local_e74 = local_3150 + -1;
                        local_e7c = local_314c + -1;
                        local_e70 = local_2a58;
                        local_e78 = local_3148;
                        local_e94 = local_314c + -1;
                        local_e88 = local_2a58;
                        local_e8c = local_3150;
                        local_e90 = local_3148;
                        local_1e54 = local_314c + 1;
                        local_1e48 = local_2a48;
                        local_1e4c = local_3150;
                        local_1e50 = local_3148;
                        local_ea4 = local_3150 + -1;
                        local_ea8 = local_3148 + -1;
                        local_ea0 = local_2a58;
                        local_eac = local_314c;
                        local_ec0 = local_3148 + -1;
                        local_eb8 = local_2a58;
                        local_ebc = local_3150;
                        local_ec4 = local_314c;
                        local_ed4 = local_3150 + -1;
                        local_ed0 = local_2a58;
                        local_ed8 = local_3148;
                        local_edc = local_314c;
                        local_ee8 = local_2a58;
                        local_eec = local_3150;
                        local_ef0 = local_3148;
                        local_ef4 = local_314c;
                        local_3160 = local_2ab8 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_3150 - (int)local_2a48[4]) +
                                        (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1e3c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_e44 - (int)local_2a58[4]) +
                                           (long)(local_e48 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_e4c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_e60 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_e64 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_e74 - (int)local_2a58[4]) +
                                           (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_e7c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_3148 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_e94 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3150 - (int)local_2a48[4]) +
                                       (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1e54 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_ea4 - (int)local_2a58[4]) +
                                          (long)(local_ea8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_ec0 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_ed4 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2ab0 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_3150 - (int)local_2a48[4]) +
                                        (long)(local_1e08 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_d84 - (int)local_2a58[4]) +
                                           (long)(local_d88 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_d8c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_da0 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_da4 - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8) +
                                         *(double *)
                                          (*local_2a58 +
                                          ((long)(local_db4 - (int)local_2a58[4]) +
                                           (long)(local_db8 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_dd0 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_314c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3150 - (int)local_2a48[4]) +
                                       (long)(local_1e20 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_de4 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_dec - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_3150 - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_e04 - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8) +
                                        *(double *)
                                         (*local_2a58 +
                                         ((long)(local_e14 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8))) +
                                     local_2aa0 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_1dec - (int)local_2a48[4]) +
                                        (long)(local_1df0 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_3150 - (int)local_2a58[4]) +
                                           (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_d5c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_3148 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_314c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1dd4 - (int)local_2a48[4]) +
                                       (long)(local_1dd8 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_d24 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_d2c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_d3c - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_314c - (int)local_2a58[5]) *
                                              local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1da4 - (int)local_2a48[4]) +
                                       (long)(local_1da8 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_cc4 - (int)local_2a58[4]) +
                                          (long)(local_cc8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_ccc - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_cdc - (int)local_2a58[4]) +
                                               (long)(local_ce0 - *(int *)((long)local_2a58 + 0x24))
                                               * local_2a58[1] +
                                              (long)(local_314c - (int)local_2a58[5]) *
                                              local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1dbc - (int)local_2a48[4]) +
                                       (long)(local_1dc0 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_3150 - (int)local_2a58[4]) +
                                          (long)(local_cf8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_cfc - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_3150 - (int)local_2a58[4]) +
                                               (long)(local_d10 - *(int *)((long)local_2a58 + 0x24))
                                               * local_2a58[1] +
                                              (long)(local_314c - (int)local_2a58[5]) *
                                              local_2a58[2]) * 8))) +
                                     local_2a98 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_1d8c - (int)local_2a48[4]) +
                                        (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1d94 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_3150 - (int)local_2a58[4]) +
                                           (long)(local_c98 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_3148 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_314c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1d74 - (int)local_2a48[4]) +
                                       (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1d7c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_c64 - (int)local_2a58[4]) +
                                          (long)(local_c68 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_c7c - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1d44 - (int)local_2a48[4]) +
                                       (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1d4c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_c04 - (int)local_2a58[4]) +
                                          (long)(local_c08 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_c0c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_c1c - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_c24 - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_1d5c - (int)local_2a48[4]) +
                                       (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1d64 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_3150 - (int)local_2a58[4]) +
                                          (long)(local_c38 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_c3c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_3150 - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_c54 - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8))) +
                                     local_2a88 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_1ccc - (int)local_2a48[4]) +
                                        (long)(local_1cd0 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1cd4 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * *(double *)
                                         (*local_2a58 +
                                         ((long)(local_3150 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1cb4 - (int)local_2a48[4]) +
                                                (long)(local_1cb8 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1cbc - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_b14 - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c9c - (int)local_2a48[4]) +
                                                (long)(local_1ca0 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1ca4 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_b00 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c84 - (int)local_2a48[4]) +
                                                (long)(local_1c88 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1c8c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_ae4 - (int)local_2a58[4]) +
                                                (long)(local_ae8 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c6c - (int)local_2a48[4]) +
                                                (long)(local_1c70 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1c74 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_ad4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c54 - (int)local_2a48[4]) +
                                                (long)(local_1c58 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1c5c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_ab4 - (int)local_2a58[4]) +
                                                (long)(local_3148 -
                                                      *(int *)((long)local_2a58 + 0x24)) *
                                                local_2a58[1] +
                                               (long)(local_abc - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c24 - (int)local_2a48[4]) +
                                                (long)(local_1c28 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1c2c - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_a84 - (int)local_2a58[4]) +
                                                (long)(local_a88 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_a8c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8) +
                                              *(double *)
                                               (*local_2a48 +
                                               ((long)(local_1c3c - (int)local_2a48[4]) +
                                                (long)(local_1c40 -
                                                      *(int *)((long)local_2a48 + 0x24)) *
                                                local_2a48[1] +
                                               (long)(local_1c44 - (int)local_2a48[5]) *
                                               local_2a48[2]) * 8) *
                                              *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_aa0 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_aa4 - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     local_2a90 *
                                     (*(double *)
                                       (*local_2a48 +
                                       ((long)(local_3150 - (int)local_2a48[4]) +
                                        (long)(local_1d30 - *(int *)((long)local_2a48 + 0x24)) *
                                        local_2a48[1] +
                                       (long)(local_1d34 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                      * (*(double *)
                                          (*local_2a58 +
                                          ((long)(local_bd4 - (int)local_2a58[4]) +
                                           (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                           local_2a58[1] +
                                          (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                          8) + *(double *)
                                                (*local_2a58 +
                                                ((long)(local_3150 - (int)local_2a58[4]) +
                                                 (long)(local_3148 -
                                                       *(int *)((long)local_2a58 + 0x24)) *
                                                 local_2a58[1] +
                                                (long)(local_314c - (int)local_2a58[5]) *
                                                local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3150 - (int)local_2a48[4]) +
                                       (long)(local_1d18 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1d1c - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_ba4 - (int)local_2a58[4]) +
                                          (long)(local_ba8 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) *
                                         8) + *(double *)
                                               (*local_2a58 +
                                               ((long)(local_3150 - (int)local_2a58[4]) +
                                                (long)(local_bc0 - *(int *)((long)local_2a58 + 0x24)
                                                      ) * local_2a58[1] +
                                               (long)(local_314c - (int)local_2a58[5]) *
                                               local_2a58[2]) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3150 - (int)local_2a48[4]) +
                                       (long)(local_1ce8 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1cec - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_b44 - (int)local_2a58[4]) +
                                          (long)(local_b48 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_b4c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_3150 - (int)local_2a58[4]) +
                                               (long)(local_b60 - *(int *)((long)local_2a58 + 0x24))
                                               * local_2a58[1] +
                                              (long)(local_b64 - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8)) +
                                     *(double *)
                                      (*local_2a48 +
                                      ((long)(local_3150 - (int)local_2a48[4]) +
                                       (long)(local_1d00 - *(int *)((long)local_2a48 + 0x24)) *
                                       local_2a48[1] +
                                      (long)(local_1d04 - (int)local_2a48[5]) * local_2a48[2]) * 8)
                                     * (*(double *)
                                         (*local_2a58 +
                                         ((long)(local_b74 - (int)local_2a58[4]) +
                                          (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                          local_2a58[1] +
                                         (long)(local_b7c - (int)local_2a58[5]) * local_2a58[2]) * 8
                                         ) + *(double *)
                                              (*local_2a58 +
                                              ((long)(local_3150 - (int)local_2a58[4]) +
                                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)
                                                     ) * local_2a58[1] +
                                              (long)(local_b94 - (int)local_2a58[5]) * local_2a58[2]
                                              ) * 8)));
                        local_f04 = local_3150 + -1;
                        local_f08 = local_3148 + -1;
                        local_f0c = local_314c + -1;
                        local_f00 = local_2a58;
                        local_f1c = local_3150 + -1;
                        local_f24 = local_314c + -1;
                        local_f18 = local_2a58;
                        local_f20 = local_3148;
                        local_f34 = local_3150 + -1;
                        local_f38 = local_3148 + -1;
                        local_f30 = local_2a58;
                        local_f3c = local_314c;
                        local_f4c = local_3150 + -1;
                        local_f48 = local_2a58;
                        local_f50 = local_3148;
                        local_f54 = local_314c;
                        local_40c = local_3150 - (int)local_2ac8;
                        local_408 = local_2c00;
                        local_408[local_40c] =
                             local_2aa8 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_f04 - (int)local_2a58[4]) +
                                (long)(local_f08 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_f0c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_f1c - (int)local_2a58[4]) +
                                (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_f24 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_f34 - (int)local_2a58[4]) +
                                (long)(local_f38 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_f4c - (int)local_2a58[4]) +
                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_41c = local_3150 - (int)local_2ac8;
                        local_418 = local_2d00;
                        local_418[local_41c] = local_3158;
                        local_f68 = local_3148 + -1;
                        local_f6c = local_314c + -1;
                        local_f60 = local_2a58;
                        local_f64 = local_3150;
                        local_f84 = local_314c + -1;
                        local_f78 = local_2a58;
                        local_f7c = local_3150;
                        local_f80 = local_3148;
                        local_f98 = local_3148 + -1;
                        local_f90 = local_2a58;
                        local_f94 = local_3150;
                        local_f9c = local_314c;
                        local_fa8 = local_2a58;
                        local_fac = local_3150;
                        local_fb0 = local_3148;
                        local_fb4 = local_314c;
                        local_42c = local_3150 - (int)local_2ac8;
                        local_428 = local_2e00;
                        local_428[local_42c] =
                             local_2aa8 *
                             (*(double *)
                               (*local_2a58 +
                               ((long)(local_3150 - (int)local_2a58[4]) +
                                (long)(local_f68 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_f6c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_3150 - (int)local_2a58[4]) +
                                (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_f84 - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                              *(double *)
                               (*local_2a58 +
                               ((long)(local_3150 - (int)local_2a58[4]) +
                                (long)(local_f98 - *(int *)((long)local_2a58 + 0x24)) *
                                local_2a58[1] +
                               (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8) +
                             *(double *)
                              (*local_2a58 +
                              ((long)(local_3150 - (int)local_2a58[4]) +
                               (long)(local_3148 - *(int *)((long)local_2a58 + 0x24)) *
                               local_2a58[1] +
                              (long)(local_314c - (int)local_2a58[5]) * local_2a58[2]) * 8));
                        local_43c = local_3150 - (int)local_2ac8;
                        local_438 = local_2f00;
                        local_438[local_43c] = 0.0;
                        local_fc0 = local_2a50;
                        local_fc4 = local_3150;
                        local_fc8 = local_3148;
                        local_fcc = local_314c;
                        local_44c = local_3150 - (int)local_2ac8;
                        local_448 = local_3000;
                        local_448[local_44c] =
                             *(double *)
                              (*local_2a50 +
                              ((long)(local_3150 - (int)local_2a50[4]) +
                               (long)(local_3148 - *(int *)((long)local_2a50 + 0x24)) *
                               local_2a50[1] +
                              (long)(local_314c - (int)local_2a50[5]) * local_2a50[2]) * 8) -
                             local_3160;
                      }
                      else {
                        local_45c = local_3150 - (int)local_2ac8;
                        local_458 = local_2c00;
                        local_458[local_45c] = 0.0;
                        local_46c = local_3150 - (int)local_2ac8;
                        local_468 = local_2d00;
                        local_468[local_46c] = 1.0;
                        local_47c = local_3150 - (int)local_2ac8;
                        local_478 = local_2e00;
                        local_478[local_47c] = 0.0;
                        local_48c = local_3150 - (int)local_2ac8;
                        local_488 = local_2f00;
                        local_488[local_48c] = 0.0;
                        local_49c = local_3150 - (int)local_2ac8;
                        local_498 = local_3000;
                        local_498[local_49c] = 0.0;
                      }
                    }
                    local_110 = local_2c00;
                    local_118 = local_2d00;
                    local_120 = local_2e00;
                    local_128 = local_3000;
                    local_130 = local_2f00;
                    local_138 = local_3100;
                    local_13c = local_2b00;
                    local_c = 0;
                    local_148 = local_2d00[0];
                    local_1c = 0;
                    local_2f00[0] = local_3000[0] / local_2d00[0];
                    local_2c = 0;
                    local_28 = local_130;
                    local_18 = local_128;
                    local_8 = local_118;
                    for (local_14c = 1; local_14c <= local_13c + -1; local_14c = local_14c + 1) {
                      local_3c = local_14c + -1;
                      local_38 = local_120;
                      local_48 = local_138;
                      local_4c = local_14c;
                      *(double *)(local_138 + (long)local_14c * 8) = local_120[local_3c] / local_148
                      ;
                      local_58 = local_118;
                      local_5c = local_14c;
                      local_68 = local_110;
                      local_6c = local_14c;
                      local_78 = local_138;
                      local_7c = local_14c;
                      local_148 = -local_110[local_14c] *
                                  *(double *)(local_138 + (long)local_14c * 8) +
                                  local_118[local_14c];
                      if ((local_148 == 0.0) && (!NAN(local_148))) {
                        local_108 = ">>>TRIDIAG FAILED";
                        Abort_host((char *)in_stack_ffffffffffffb670);
                      }
                      local_88 = local_128;
                      local_8c = local_14c;
                      local_98 = local_110;
                      local_9c = local_14c;
                      local_a8 = local_130;
                      local_ac = local_14c + -1;
                      local_b8 = local_130;
                      local_bc = local_14c;
                      local_130[local_14c] =
                           (-local_110[local_14c] * local_130[local_ac] + local_128[local_14c]) /
                           local_148;
                    }
                    for (local_150 = local_13c + -2; -1 < local_150; local_150 = local_150 + -1) {
                      local_c8 = local_130;
                      local_cc = local_150;
                      local_d8 = local_138;
                      local_dc = local_150 + 1;
                      local_e8 = local_130;
                      local_ec = local_150 + 1;
                      local_f8 = local_130;
                      local_fc = local_150;
                      local_130[local_150] =
                           -*(double *)(local_138 + (long)local_dc * 8) * local_130[local_ec] +
                           local_130[local_150];
                    }
                    for (local_3164 = (int)local_2ac8; local_3164 <= (int)local_2ae4;
                        local_3164 = local_3164 + 1) {
                      local_3fc = local_3164 - (int)local_2ac8;
                      local_3f8 = local_2f00;
                      local_1c08 = local_2a48;
                      local_1c0c = local_3164;
                      local_1c10 = local_3148;
                      local_1c14 = local_314c;
                      *(double *)
                       (*local_2a48 +
                       ((long)(local_3164 - (int)local_2a48[4]) +
                        (long)(local_3148 - *(int *)((long)local_2a48 + 0x24)) * local_2a48[1] +
                       (long)(local_314c - (int)local_2a48[5]) * local_2a48[2]) * 8) =
                           local_3f8[local_3fc];
                    }
                  }
                }
              }
              else {
                local_610 = "mlndlap_gauss_seidel_with_line_solve_aa is wrong direction.";
                Abort_host((char *)in_stack_ffffffffffffb670);
              }
            }
          }
          else {
            for (local_40f8.sz.kstride._4_4_ = 0;
                local_40f8.sz.kstride._4_4_ < *(int *)(in_RDI + 0x568);
                local_40f8.sz.kstride._4_4_ = local_40f8.sz.kstride._4_4_ + 1) {
              local_3170 = local_3e08;
              local_3178 = local_3e78;
              local_3180 = local_3ec0;
              local_3188 = local_3e30;
              local_3190 = local_3f08;
              local_3198 = &local_3830;
              local_6dc = 0;
              local_6ec = 0;
              local_31a0 = local_3830.arr[0] * 0.027777777777777776 * local_3830.arr[0];
              local_6fc = 1;
              local_70c = 1;
              local_31a8 = local_3830.arr[1] * 0.027777777777777776 * local_3830.arr[1];
              local_71c = 2;
              local_72c = 2;
              local_31b0 = local_3830.arr[2] * 0.027777777777777776 * local_3830.arr[2];
              local_31b8 = local_31a0 + local_31a8 + local_31b0;
              local_31c0 = local_31b0 + local_31b0 + local_31a8 + local_31a8 + -local_31a0;
              local_31c8 = local_31b0 + local_31b0 + local_31a0 + local_31a0 + -local_31a8;
              local_31d0 = (local_31a0 + local_31a0 + local_31a8 * 2.0) - local_31b0;
              local_31d8 = (local_31a0 * 4.0 + -(local_31a8 * 2.0)) - (local_31b0 + local_31b0);
              local_31e0 = (local_31a8 * 4.0 - (local_31a0 + local_31a0)) -
                           (local_31b0 + local_31b0);
              local_31e8 = local_31b0 * 4.0 + (-(local_31a8 * 2.0) - (local_31a0 + local_31a0));
              bx_00 = local_3e08;
              local_728 = local_3198;
              local_718 = local_3198;
              local_708 = local_3198;
              local_6f8 = local_3198;
              local_6e8 = local_3198;
              local_6d8 = local_3198;
              memcpy(local_3320,local_3f08,0x3c);
              memcpy(auStack_32e0,local_3178,0x3c);
              local_32a0 = local_31b8;
              memcpy(auStack_3298,local_3188,0x3c);
              local_3258 = local_31c0;
              local_3250 = local_31c8;
              local_3248 = local_31d0;
              local_3240 = local_31d8;
              local_3238 = local_31e0;
              local_3230 = local_31e8;
              memcpy(auStack_3228,local_3180,0x3c);
              Loop<amrex::mlndlap_gauss_seidel_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        (bx_00,(anon_class_312_11_b8f6ed96 *)in_stack_ffffffffffffb6a0);
            }
          }
          MFIter::operator++(&local_3e00);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
      else {
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffb690,in_stack_ffffffffffffb688,flags_);
        while (bVar1 = MFIter::isValid(&local_3bc0), bVar1) {
          MFIter::validbox(in_stack_ffffffffffffb670);
          local_3bc8 = local_3be4;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1483d21
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3bf0 = local_3c30;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1483d63
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3c38 = local_3c78;
          std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
          operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                      *)in_stack_ffffffffffffb660,(size_type)in_stack_ffffffffffffb658);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1483da5
                    );
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3c80 = local_3cc0;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3cc8 = local_3d08;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3d10 = local_3d50;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffb668,
                     in_stack_ffffffffffffb660);
          local_3d58 = local_3d98;
          for (local_3d9c = 0; local_3d9c < *(int *)(in_RDI + 0x568); local_3d9c = local_3d9c + 1) {
            local_3328 = local_3bc8;
            local_3330 = local_3cc8;
            local_3338 = local_3d10;
            local_3340 = local_3bf0;
            local_3348 = local_3c38;
            local_3350 = local_3c80;
            local_3358 = local_3d58;
            local_3360 = &local_3830;
            local_67c = 0;
            local_68c = 0;
            local_3368 = local_3830.arr[0] * 0.027777777777777776 * local_3830.arr[0];
            local_69c = 1;
            local_6ac = 1;
            local_3370 = local_3830.arr[1] * 0.027777777777777776 * local_3830.arr[1];
            local_6bc = 2;
            local_6cc = 2;
            local_3378 = local_3830.arr[2] * 0.027777777777777776 * local_3830.arr[2];
            local_6c8 = local_3360;
            local_6b8 = local_3360;
            local_6a8 = local_3360;
            local_698 = local_3360;
            local_688 = local_3360;
            local_678 = local_3360;
            memcpy(local_3510,local_3d58,0x3c);
            memcpy(auStack_34d0,local_3330,0x3c);
            local_3490 = local_3368;
            memcpy(auStack_3488,local_3340,0x3c);
            local_3448 = local_3370;
            memcpy(auStack_3440,local_3348,0x3c);
            local_3400 = local_3378;
            memcpy(auStack_33f8,local_3350,0x3c);
            memcpy(auStack_33b8,local_3338,0x3c);
            Loop<amrex::mlndlap_gauss_seidel_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                      (in_stack_ffffffffffffb6a8,in_stack_ffffffffffffb6a0);
          }
          MFIter::operator++(&local_3bc0);
        }
        MFIter::~MFIter(in_stack_ffffffffffffb660);
      }
    }
    MLNodeLinOp::nodalSync
              (in_stack_ffffffffffffb690,(int)((ulong)in_stack_ffffffffffffb688 >> 0x20),
               (int)in_stack_ffffffffffffb688,(MultiFab *)in_stack_ffffffffffffb680);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs) const
{
    BL_PROFILE("MLNodeLaplacian::Fsmooth()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto solarr_ma = sol.arrays();
        auto rhsarr_ma = rhs.const_arrays();
        auto dmskarr_ma = dmsk.const_arrays();
        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto starr_ma = stencil->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_sten(i,j,k,solarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                    mlndlap_jacobi_sten(i,j,k,solarr_ma[box_no],Ax,rhsarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                });
            }
        }
        else if (sigma[0] == nullptr)
        {
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                Real const_sigma = m_const_sigma;
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_c(i,j,k,solarr_ma[box_no],const_sigma,dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                              is_rz,
#endif
                                              dxinvarr);
                    mlndlap_jacobi_c(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], const_sigma,
                                     dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else if ((m_use_harmonic_average && mglev > 0) || m_use_mapped)
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_ha(i,j,k,solarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_ha(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]),
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_aa(i,j,k,solarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_aa(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], sarr_ma[box_no],
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }

        Gpu::streamSynchronize();
        if (m_smooth_num_sweeps > 1) nodalSync(amrlev, mglev, sol);
    }
    else // cpu
#endif
    {
        bool regular_coarsening = true;
        if (amrlev == 0 && mglev > 0)
        {
            regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
        }
        if (sigma[0] == nullptr) {
            AMREX_ALWAYS_ASSERT(regular_coarsening);
        }

        if (m_use_gauss_seidel)
        {
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& starr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_sten(bx,solarr,rhsarr,starr,dmskarr);
                    }
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_c(bx, solarr, rhsarr,
                                               const_sigma, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                               ,is_rz
#endif
                            );
                    }
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_ha(bx, solarr, rhsarr,
                                                AMREX_D_DECL(sxarr,syarr,szarr),
                                                dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                ,is_rz
#endif
                            );
                    }
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {

                    const Box& bx = mfi.validbox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    if ( regular_coarsening )
                    {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_aa(bx, solarr, rhsarr,
                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                   ,is_rz
#endif
                                 );
                        }
                    } else {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_with_line_solve_aa(bx, solarr, rhsarr,
                                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                                   ,is_rz
#endif
                                );
                        }
                    }
                }
            }

            nodalSync(amrlev, mglev, sol);
        }
        else
        {
            MultiFab Ax(sol.boxArray(), sol.DistributionMap(), 1, 0);
            Fapply(amrlev, mglev, Ax, sol);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& stenarr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_sten(bx,solarr,Axarr,rhsarr,stenarr,dmskarr);
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_c (bx, solarr, Axarr, rhsarr, const_sigma,
                                      dmskarr, dxinvarr);
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_ha (bx, solarr, Axarr, rhsarr, AMREX_D_DECL(sxarr,syarr,szarr),
                                       dmskarr, dxinvarr);
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_aa (bx, solarr, Axarr, rhsarr, sarr,
                                       dmskarr, dxinvarr);
                }
            }
        }
    }
}